

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  uint uVar3;
  BVH *bvh;
  NodeRef root;
  float *pfVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [28];
  int iVar76;
  undefined1 (*pauVar77) [32];
  ulong uVar78;
  undefined1 auVar79 [8];
  uint uVar80;
  ulong *puVar81;
  ulong uVar82;
  long lVar83;
  ulong uVar84;
  undefined4 uVar85;
  ulong unaff_R15;
  bool bVar86;
  float fVar87;
  float fVar102;
  float fVar103;
  float fVar105;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar118;
  float fVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 in_ZMM2 [64];
  undefined1 auVar141 [32];
  float fVar146;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar165 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar176;
  undefined1 auVar175 [64];
  float fVar177;
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5f89;
  ulong local_5f88;
  undefined1 local_5f80 [8];
  float fStack_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  float fStack_5f68;
  uint uStack_5f64;
  RayK<8> *local_5f50;
  RayK<8> *local_5f48;
  undefined1 local_5f40 [32];
  undefined1 local_5f20 [8];
  undefined1 auStack_5f18 [8];
  float fStack_5f10;
  float fStack_5f0c;
  float fStack_5f08;
  undefined1 (*local_5ef8) [32];
  RTCFilterFunctionNArguments local_5ef0;
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  ulong local_5e70;
  Scene *local_5e68;
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  RTCHitN local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  uint local_5bc0;
  uint uStack_5bbc;
  uint uStack_5bb8;
  uint uStack_5bb4;
  uint uStack_5bb0;
  uint uStack_5bac;
  uint uStack_5ba8;
  uint uStack_5ba4;
  uint local_5ba0;
  uint uStack_5b9c;
  uint uStack_5b98;
  uint uStack_5b94;
  uint uStack_5b90;
  uint uStack_5b8c;
  uint uStack_5b88;
  uint uStack_5b84;
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b60;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [8];
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [8];
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  float fStack_5884;
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  float fVar104;
  float fVar106;
  undefined1 auVar167 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar128 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar107 = ZEXT816(0) << 0x40;
      auVar122 = vpcmpeqd_avx2(auVar128,(undefined1  [32])valid_i->field_0);
      auVar128 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar107),5);
      auVar111 = auVar122 & auVar128;
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0x7f,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0xbf,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar111[0x1f] < '\0') {
        auVar128 = vandps_avx(auVar128,auVar122);
        auVar15 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
        local_5b60._0_8_ = *(undefined8 *)ray;
        local_5b60._8_8_ = *(undefined8 *)(ray + 8);
        local_5b60._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b60._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b60._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b60._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b60._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b60._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b60._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b60._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b60._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b60._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b00 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar123._8_4_ = 0x7fffffff;
        auVar123._0_8_ = 0x7fffffff7fffffff;
        auVar123._12_4_ = 0x7fffffff;
        auVar123._16_4_ = 0x7fffffff;
        auVar123._20_4_ = 0x7fffffff;
        auVar123._24_4_ = 0x7fffffff;
        auVar123._28_4_ = 0x7fffffff;
        auVar175 = ZEXT3264(auVar123);
        auVar112._8_4_ = 0x219392ef;
        auVar112._0_8_ = 0x219392ef219392ef;
        auVar112._12_4_ = 0x219392ef;
        auVar112._16_4_ = 0x219392ef;
        auVar112._20_4_ = 0x219392ef;
        auVar112._24_4_ = 0x219392ef;
        auVar112._28_4_ = 0x219392ef;
        auVar171._8_4_ = 0x3f800000;
        auVar171._0_8_ = &DAT_3f8000003f800000;
        auVar171._12_4_ = 0x3f800000;
        auVar171._16_4_ = 0x3f800000;
        auVar171._20_4_ = 0x3f800000;
        auVar171._24_4_ = 0x3f800000;
        auVar171._28_4_ = 0x3f800000;
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar147 = vdivps_avx(auVar171,local_5b00);
        auVar128 = vandps_avx(auVar123,local_5b00);
        auVar111 = vcmpps_avx(auVar128,auVar112,1);
        auVar128 = vandps_avx(auVar123,local_5ae0);
        auVar122 = vcmpps_avx(auVar128,auVar112,1);
        auVar159 = ZEXT3264(auVar122);
        auVar150 = vdivps_avx(auVar171,local_5ae0);
        auVar128 = vandps_avx(auVar123,local_5ac0);
        auVar165._8_4_ = 0x5d5e0b6b;
        auVar165._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar165._12_4_ = 0x5d5e0b6b;
        auVar165._16_4_ = 0x5d5e0b6b;
        auVar165._20_4_ = 0x5d5e0b6b;
        auVar165._24_4_ = 0x5d5e0b6b;
        auVar165._28_4_ = 0x5d5e0b6b;
        auVar167 = ZEXT3264(auVar165);
        _local_5aa0 = vblendvps_avx(auVar147,auVar165,auVar111);
        auVar128 = vcmpps_avx(auVar128,auVar112,1);
        auVar111 = vdivps_avx(auVar171,local_5ac0);
        local_5a80 = vblendvps_avx(auVar150,auVar165,auVar122);
        _local_5a60 = vblendvps_avx(auVar111,auVar165,auVar128);
        auVar128 = vcmpps_avx(_local_5aa0,ZEXT1632(auVar107),1);
        auVar150._8_4_ = 0x20;
        auVar150._0_8_ = 0x2000000020;
        auVar150._12_4_ = 0x20;
        auVar150._16_4_ = 0x20;
        auVar150._20_4_ = 0x20;
        auVar150._24_4_ = 0x20;
        auVar150._28_4_ = 0x20;
        local_5a40 = vandps_avx(auVar128,auVar150);
        auVar111 = ZEXT1632(auVar107);
        auVar128 = vcmpps_avx(local_5a80,auVar111,5);
        auVar122._8_4_ = 0x40;
        auVar122._0_8_ = 0x4000000040;
        auVar122._12_4_ = 0x40;
        auVar122._16_4_ = 0x40;
        auVar122._20_4_ = 0x40;
        auVar122._24_4_ = 0x40;
        auVar122._28_4_ = 0x40;
        auVar151._8_4_ = 0x60;
        auVar151._0_8_ = 0x6000000060;
        auVar151._12_4_ = 0x60;
        auVar151._16_4_ = 0x60;
        auVar151._20_4_ = 0x60;
        auVar151._24_4_ = 0x60;
        auVar151._28_4_ = 0x60;
        local_5a20 = vblendvps_avx(auVar151,auVar122,auVar128);
        auVar128 = vcmpps_avx(_local_5a60,auVar111,5);
        auVar147._8_4_ = 0x80;
        auVar147._0_8_ = 0x8000000080;
        auVar147._12_4_ = 0x80;
        auVar147._16_4_ = 0x80;
        auVar147._20_4_ = 0x80;
        auVar147._24_4_ = 0x80;
        auVar147._28_4_ = 0x80;
        auVar98._8_4_ = 0xa0;
        auVar98._0_8_ = 0xa0000000a0;
        auVar98._12_4_ = 0xa0;
        auVar98._16_4_ = 0xa0;
        auVar98._20_4_ = 0xa0;
        auVar98._24_4_ = 0xa0;
        auVar98._28_4_ = 0xa0;
        auVar152 = ZEXT3264(auVar98);
        local_5a00 = vblendvps_avx(auVar98,auVar147,auVar128);
        auVar128 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar111);
        local_5960 = vpmovsxwd_avx2(auVar15);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar170 = ZEXT3264(local_4680);
        local_59e0 = vblendvps_avx(local_4680,auVar128,local_5960);
        auVar128 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar111);
        auVar111._8_4_ = 0xff800000;
        auVar111._0_8_ = 0xff800000ff800000;
        auVar111._12_4_ = 0xff800000;
        auVar111._16_4_ = 0xff800000;
        auVar111._20_4_ = 0xff800000;
        auVar111._24_4_ = 0xff800000;
        auVar111._28_4_ = 0xff800000;
        auVar117 = ZEXT3264(auVar111);
        local_59c0 = vblendvps_avx(auVar111,auVar128,local_5960);
        auVar107 = vpcmpeqd_avx(local_59c0._0_16_,local_59c0._0_16_);
        local_5e40 = vpmovsxwd_avx2(auVar15 ^ auVar107);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar80 = 7;
        }
        else {
          uVar80 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f48 = ray + 0x100;
        puVar81 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar77 = (undefined1 (*) [32])local_4640;
        local_5808 = (bvh->root).ptr;
        local_4660 = local_59e0;
        local_5980 = mm_lookupmask_ps._16_8_;
        uStack_5978 = mm_lookupmask_ps._24_8_;
        uStack_5970 = mm_lookupmask_ps._16_8_;
        uStack_5968 = mm_lookupmask_ps._24_8_;
        local_5ef8 = (undefined1 (*) [32])&local_5ba0;
        local_59a0 = mm_lookupmask_pd._0_8_;
        uStack_5998 = mm_lookupmask_pd._8_8_;
        uStack_5990 = mm_lookupmask_pd._0_8_;
        uStack_5988 = mm_lookupmask_pd._8_8_;
LAB_00694512:
        pauVar77 = pauVar77 + -1;
        root.ptr = puVar81[-1];
        puVar81 = puVar81 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_00695810;
        _local_5f80 = *pauVar77;
        auVar128 = vcmpps_avx(_local_5f80,local_59c0,1);
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar128[0x1f]) {
LAB_00695821:
          iVar76 = 2;
        }
        else {
          uVar85 = vmovmskps_avx(auVar128);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar85);
          iVar76 = 0;
          if ((uint)POPCOUNT(uVar85) <= uVar80) {
            if (unaff_R15 != 0) {
              local_5e60 = auVar175._0_32_;
              local_5f50 = ray;
              do {
                k = 0;
                for (uVar84 = unaff_R15; (uVar84 & 1) == 0;
                    uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                  k = k + 1;
                }
                local_5f40._0_8_ = k;
                auVar117 = ZEXT1664(auVar117._0_16_);
                auVar152 = ZEXT1664(auVar152._0_16_);
                auVar159 = ZEXT1664(auVar159._0_16_);
                auVar167 = ZEXT1664(auVar167._0_16_);
                bVar86 = occluded1(This,bvh,root,k,&local_5f89,local_5f50,
                                   (TravRayK<8,_true> *)&local_5b60.field_0,context);
                if (bVar86) {
                  *(undefined4 *)(local_5e40 + local_5f40._0_8_ * 4) = 0xffffffff;
                }
                unaff_R15 = unaff_R15 - 1 & unaff_R15;
                auVar175 = ZEXT3264(local_5e60);
                auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                ray = local_5f50;
              } while (unaff_R15 != 0);
            }
            auVar128 = _DAT_0205a980 & ~local_5e40;
            iVar76 = 3;
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0x7f,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0xbf,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar128[0x1f] < '\0') {
              auVar117 = ZEXT3264(local_59c0);
              auVar128._8_4_ = 0xff800000;
              auVar128._0_8_ = 0xff800000ff800000;
              auVar128._12_4_ = 0xff800000;
              auVar128._16_4_ = 0xff800000;
              auVar128._20_4_ = 0xff800000;
              auVar128._24_4_ = 0xff800000;
              auVar128._28_4_ = 0xff800000;
              local_59c0 = vblendvps_avx(local_59c0,auVar128,local_5e40);
              iVar76 = 2;
            }
          }
          if (uVar80 < (uint)POPCOUNT(uVar85)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00695810;
                auVar128 = vcmpps_avx(local_59c0,_local_5f80,6);
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar128 >> 0x7f,0) == '\0') &&
                      (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar128 >> 0xbf,0) == '\0') &&
                    (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar128[0x1f]) goto LAB_00695821;
                local_5e70 = (ulong)((uint)root.ptr & 0xf) - 8;
                if (local_5e70 == 0) {
                  auVar128 = vpcmpeqd_avx2(auVar117._0_32_,auVar117._0_32_);
                  auVar101 = local_5e40;
                  goto LAB_006957d2;
                }
                auVar108._0_8_ = local_5e40._0_8_ ^ 0xffffffffffffffff;
                auVar108._8_4_ = local_5e40._8_4_ ^ 0xffffffff;
                auVar108._12_4_ = local_5e40._12_4_ ^ 0xffffffff;
                auVar108._16_4_ = local_5e40._16_4_ ^ 0xffffffff;
                auVar108._20_4_ = local_5e40._20_4_ ^ 0xffffffff;
                auVar108._24_4_ = local_5e40._24_4_ ^ 0xffffffff;
                auVar108._28_4_ = local_5e40._28_4_ ^ 0xffffffff;
                lVar83 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar84 = 0;
                local_5e60 = auVar175._0_32_;
                goto LAB_00694765;
              }
              auVar179 = ZEXT3264(auVar170._0_32_);
              uVar84 = 0;
              uVar82 = 8;
              do {
                uVar78 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar84 * 8);
                if (uVar78 != 8) {
                  uVar85 = *(undefined4 *)(root.ptr + 0x40 + uVar84 * 4);
                  auVar88._4_4_ = uVar85;
                  auVar88._0_4_ = uVar85;
                  auVar88._8_4_ = uVar85;
                  auVar88._12_4_ = uVar85;
                  auVar88._16_4_ = uVar85;
                  auVar88._20_4_ = uVar85;
                  auVar88._24_4_ = uVar85;
                  auVar88._28_4_ = uVar85;
                  auVar67._8_8_ = local_5b60._8_8_;
                  auVar67._0_8_ = local_5b60._0_8_;
                  auVar67._16_8_ = local_5b60._16_8_;
                  auVar67._24_8_ = local_5b60._24_8_;
                  auVar68._8_8_ = local_5b60._40_8_;
                  auVar68._0_8_ = local_5b60._32_8_;
                  auVar68._16_8_ = local_5b60._48_8_;
                  auVar68._24_8_ = local_5b60._56_8_;
                  auVar69._8_8_ = local_5b60._72_8_;
                  auVar69._0_8_ = local_5b60._64_8_;
                  auVar69._16_8_ = local_5b60._80_8_;
                  auVar69._24_8_ = local_5b60._88_8_;
                  auVar128 = vsubps_avx(auVar88,auVar67);
                  auVar153._0_4_ = (float)local_5aa0._0_4_ * auVar128._0_4_;
                  auVar153._4_4_ = (float)local_5aa0._4_4_ * auVar128._4_4_;
                  auVar153._8_4_ = fStack_5a98 * auVar128._8_4_;
                  auVar153._12_4_ = fStack_5a94 * auVar128._12_4_;
                  auVar153._16_4_ = fStack_5a90 * auVar128._16_4_;
                  auVar153._20_4_ = fStack_5a8c * auVar128._20_4_;
                  auVar153._28_36_ = auVar152._28_36_;
                  auVar153._24_4_ = fStack_5a88 * auVar128._24_4_;
                  auVar122 = auVar153._0_32_;
                  auVar152 = ZEXT3264(auVar122);
                  uVar85 = *(undefined4 *)(root.ptr + 0x80 + uVar84 * 4);
                  auVar89._4_4_ = uVar85;
                  auVar89._0_4_ = uVar85;
                  auVar89._8_4_ = uVar85;
                  auVar89._12_4_ = uVar85;
                  auVar89._16_4_ = uVar85;
                  auVar89._20_4_ = uVar85;
                  auVar89._24_4_ = uVar85;
                  auVar89._28_4_ = uVar85;
                  auVar128 = vsubps_avx(auVar89,auVar68);
                  auVar160._0_4_ = local_5a80._0_4_ * auVar128._0_4_;
                  auVar160._4_4_ = local_5a80._4_4_ * auVar128._4_4_;
                  auVar160._8_4_ = local_5a80._8_4_ * auVar128._8_4_;
                  auVar160._12_4_ = local_5a80._12_4_ * auVar128._12_4_;
                  auVar160._16_4_ = local_5a80._16_4_ * auVar128._16_4_;
                  auVar160._20_4_ = local_5a80._20_4_ * auVar128._20_4_;
                  auVar160._28_36_ = auVar159._28_36_;
                  auVar160._24_4_ = local_5a80._24_4_ * auVar128._24_4_;
                  auVar147 = auVar160._0_32_;
                  auVar159 = ZEXT3264(auVar147);
                  uVar85 = *(undefined4 *)(root.ptr + 0xc0 + uVar84 * 4);
                  auVar90._4_4_ = uVar85;
                  auVar90._0_4_ = uVar85;
                  auVar90._8_4_ = uVar85;
                  auVar90._12_4_ = uVar85;
                  auVar90._16_4_ = uVar85;
                  auVar90._20_4_ = uVar85;
                  auVar90._24_4_ = uVar85;
                  auVar90._28_4_ = uVar85;
                  auVar128 = vsubps_avx(auVar90,auVar69);
                  auVar168._0_4_ = (float)local_5a60._0_4_ * auVar128._0_4_;
                  auVar168._4_4_ = (float)local_5a60._4_4_ * auVar128._4_4_;
                  auVar168._8_4_ = fStack_5a58 * auVar128._8_4_;
                  auVar168._12_4_ = fStack_5a54 * auVar128._12_4_;
                  auVar168._16_4_ = fStack_5a50 * auVar128._16_4_;
                  auVar168._20_4_ = fStack_5a4c * auVar128._20_4_;
                  auVar168._28_36_ = auVar167._28_36_;
                  auVar168._24_4_ = fStack_5a48 * auVar128._24_4_;
                  auVar150 = auVar168._0_32_;
                  auVar167 = ZEXT3264(auVar150);
                  uVar85 = *(undefined4 *)(root.ptr + 0x60 + uVar84 * 4);
                  auVar91._4_4_ = uVar85;
                  auVar91._0_4_ = uVar85;
                  auVar91._8_4_ = uVar85;
                  auVar91._12_4_ = uVar85;
                  auVar91._16_4_ = uVar85;
                  auVar91._20_4_ = uVar85;
                  auVar91._24_4_ = uVar85;
                  auVar91._28_4_ = uVar85;
                  auVar128 = vsubps_avx(auVar91,auVar67);
                  auVar19._4_4_ = (float)local_5aa0._4_4_ * auVar128._4_4_;
                  auVar19._0_4_ = (float)local_5aa0._0_4_ * auVar128._0_4_;
                  auVar19._8_4_ = fStack_5a98 * auVar128._8_4_;
                  auVar19._12_4_ = fStack_5a94 * auVar128._12_4_;
                  auVar19._16_4_ = fStack_5a90 * auVar128._16_4_;
                  auVar19._20_4_ = fStack_5a8c * auVar128._20_4_;
                  auVar19._24_4_ = fStack_5a88 * auVar128._24_4_;
                  auVar19._28_4_ = (int)((ulong)local_5b60._24_8_ >> 0x20);
                  uVar85 = *(undefined4 *)(root.ptr + 0xa0 + uVar84 * 4);
                  auVar92._4_4_ = uVar85;
                  auVar92._0_4_ = uVar85;
                  auVar92._8_4_ = uVar85;
                  auVar92._12_4_ = uVar85;
                  auVar92._16_4_ = uVar85;
                  auVar92._20_4_ = uVar85;
                  auVar92._24_4_ = uVar85;
                  auVar92._28_4_ = uVar85;
                  auVar128 = vsubps_avx(auVar92,auVar68);
                  auVar20._4_4_ = local_5a80._4_4_ * auVar128._4_4_;
                  auVar20._0_4_ = local_5a80._0_4_ * auVar128._0_4_;
                  auVar20._8_4_ = local_5a80._8_4_ * auVar128._8_4_;
                  auVar20._12_4_ = local_5a80._12_4_ * auVar128._12_4_;
                  auVar20._16_4_ = local_5a80._16_4_ * auVar128._16_4_;
                  auVar20._20_4_ = local_5a80._20_4_ * auVar128._20_4_;
                  auVar20._24_4_ = local_5a80._24_4_ * auVar128._24_4_;
                  auVar20._28_4_ = (int)((ulong)local_5b60._56_8_ >> 0x20);
                  uVar85 = *(undefined4 *)(root.ptr + 0xe0 + uVar84 * 4);
                  auVar93._4_4_ = uVar85;
                  auVar93._0_4_ = uVar85;
                  auVar93._8_4_ = uVar85;
                  auVar93._12_4_ = uVar85;
                  auVar93._16_4_ = uVar85;
                  auVar93._20_4_ = uVar85;
                  auVar93._24_4_ = uVar85;
                  auVar93._28_4_ = uVar85;
                  auVar128 = vsubps_avx(auVar93,auVar69);
                  auVar21._4_4_ = (float)local_5a60._4_4_ * auVar128._4_4_;
                  auVar21._0_4_ = (float)local_5a60._0_4_ * auVar128._0_4_;
                  auVar21._8_4_ = fStack_5a58 * auVar128._8_4_;
                  auVar21._12_4_ = fStack_5a54 * auVar128._12_4_;
                  auVar21._16_4_ = fStack_5a50 * auVar128._16_4_;
                  auVar21._20_4_ = fStack_5a4c * auVar128._20_4_;
                  auVar21._24_4_ = fStack_5a48 * auVar128._24_4_;
                  auVar21._28_4_ = (int)((ulong)local_5b60._88_8_ >> 0x20);
                  auVar128 = vminps_avx(auVar122,auVar19);
                  auVar111 = vminps_avx(auVar147,auVar20);
                  auVar128 = vmaxps_avx(auVar128,auVar111);
                  auVar111 = vminps_avx(auVar150,auVar21);
                  auVar128 = vmaxps_avx(auVar128,auVar111);
                  auVar22._4_4_ = auVar128._4_4_ * 0.99999964;
                  auVar22._0_4_ = auVar128._0_4_ * 0.99999964;
                  auVar22._8_4_ = auVar128._8_4_ * 0.99999964;
                  auVar22._12_4_ = auVar128._12_4_ * 0.99999964;
                  auVar22._16_4_ = auVar128._16_4_ * 0.99999964;
                  auVar22._20_4_ = auVar128._20_4_ * 0.99999964;
                  auVar22._24_4_ = auVar128._24_4_ * 0.99999964;
                  auVar22._28_4_ = auVar128._28_4_;
                  auVar128 = vmaxps_avx(auVar122,auVar19);
                  auVar111 = vmaxps_avx(auVar147,auVar20);
                  auVar111 = vminps_avx(auVar128,auVar111);
                  auVar128 = vmaxps_avx(auVar150,auVar21);
                  auVar128 = vminps_avx(auVar111,auVar128);
                  auVar23._4_4_ = auVar128._4_4_ * 1.0000004;
                  auVar23._0_4_ = auVar128._0_4_ * 1.0000004;
                  auVar23._8_4_ = auVar128._8_4_ * 1.0000004;
                  auVar23._12_4_ = auVar128._12_4_ * 1.0000004;
                  auVar23._16_4_ = auVar128._16_4_ * 1.0000004;
                  auVar23._20_4_ = auVar128._20_4_ * 1.0000004;
                  auVar23._24_4_ = auVar128._24_4_ * 1.0000004;
                  auVar23._28_4_ = auVar128._28_4_;
                  auVar128 = vmaxps_avx(auVar22,local_59e0);
                  auVar111 = vminps_avx(auVar23,local_59c0);
                  auVar128 = vcmpps_avx(auVar128,auVar111,2);
                  auVar117 = ZEXT3264(auVar128);
                  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar128 >> 0x7f,0) != '\0') ||
                        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0xbf,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar128[0x1f] < '\0') {
                    auVar128 = vblendvps_avx(auVar170._0_32_,auVar22,auVar128);
                    if (uVar82 != 8) {
                      *puVar81 = uVar82;
                      puVar81 = puVar81 + 1;
                      *pauVar77 = auVar179._0_32_;
                      pauVar77 = pauVar77 + 1;
                    }
                    auVar179 = ZEXT3264(auVar128);
                    uVar82 = uVar78;
                  }
                }
                _local_5f80 = auVar179._0_32_;
              } while ((uVar78 != 8) && (bVar86 = uVar84 < 7, uVar84 = uVar84 + 1, bVar86));
              iVar76 = 0;
              if (uVar82 == 8) {
LAB_006946fd:
                bVar86 = false;
                iVar76 = 4;
              }
              else {
                auVar128 = vcmpps_avx(local_59c0,_local_5f80,6);
                uVar85 = vmovmskps_avx(auVar128);
                bVar86 = true;
                if ((uint)POPCOUNT(uVar85) <= uVar80) {
                  *puVar81 = uVar82;
                  puVar81 = puVar81 + 1;
                  *pauVar77 = _local_5f80;
                  pauVar77 = pauVar77 + 1;
                  goto LAB_006946fd;
                }
              }
              root.ptr = uVar82;
            } while (bVar86);
          }
        }
        goto LAB_00695813;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar84 = uVar84 + 1;
    lVar83 = lVar83 + 0x60;
    auVar111 = auVar108;
    if (local_5e70 <= uVar84) break;
LAB_00694765:
    local_5e68 = context->scene;
    uVar82 = 0;
    local_5f88 = uVar84;
    local_5f40 = auVar108;
    local_5ec0 = auVar108;
    while (iVar76 = *(int *)(lVar83 + uVar82 * 4), unaff_R15 = uVar82, iVar76 != -1) {
      uVar3 = *(uint *)(lVar83 + -0x10 + uVar82 * 4);
      pfVar4 = (local_5e68->vertices).items[uVar3];
      uVar78 = (ulong)*(uint *)(lVar83 + -0x50 + uVar82 * 4);
      fVar87 = pfVar4[uVar78];
      auVar94._4_4_ = fVar87;
      auVar94._0_4_ = fVar87;
      auVar94._8_4_ = fVar87;
      auVar94._12_4_ = fVar87;
      auVar94._16_4_ = fVar87;
      auVar94._20_4_ = fVar87;
      auVar94._24_4_ = fVar87;
      auVar94._28_4_ = fVar87;
      fVar87 = pfVar4[uVar78 + 1];
      auVar120._4_4_ = fVar87;
      auVar120._0_4_ = fVar87;
      auVar120._8_4_ = fVar87;
      auVar120._12_4_ = fVar87;
      auVar120._16_4_ = fVar87;
      auVar120._20_4_ = fVar87;
      auVar120._24_4_ = fVar87;
      auVar120._28_4_ = fVar87;
      fVar87 = pfVar4[uVar78 + 2];
      auVar141._4_4_ = fVar87;
      auVar141._0_4_ = fVar87;
      auVar141._8_4_ = fVar87;
      auVar141._12_4_ = fVar87;
      auVar141._16_4_ = fVar87;
      auVar141._20_4_ = fVar87;
      auVar141._24_4_ = fVar87;
      auVar141._28_4_ = fVar87;
      uVar78 = (ulong)*(uint *)(lVar83 + -0x20 + uVar82 * 4);
      fVar87 = pfVar4[uVar78];
      local_5d80._4_4_ = fVar87;
      local_5d80._0_4_ = fVar87;
      local_5d80._8_4_ = fVar87;
      local_5d80._12_4_ = fVar87;
      local_5d80._16_4_ = fVar87;
      local_5d80._20_4_ = fVar87;
      local_5d80._24_4_ = fVar87;
      local_5d80._28_4_ = fVar87;
      fVar87 = pfVar4[uVar78 + 1];
      local_5da0._4_4_ = fVar87;
      local_5da0._0_4_ = fVar87;
      local_5da0._8_4_ = fVar87;
      local_5da0._12_4_ = fVar87;
      local_5da0._16_4_ = fVar87;
      local_5da0._20_4_ = fVar87;
      local_5da0._24_4_ = fVar87;
      local_5da0._28_4_ = fVar87;
      fVar87 = pfVar4[uVar78 + 2];
      local_5dc0._4_4_ = fVar87;
      local_5dc0._0_4_ = fVar87;
      local_5dc0._8_4_ = fVar87;
      local_5dc0._12_4_ = fVar87;
      local_5dc0._16_4_ = fVar87;
      local_5dc0._20_4_ = fVar87;
      local_5dc0._24_4_ = fVar87;
      local_5dc0._28_4_ = fVar87;
      auVar128 = *(undefined1 (*) [32])ray;
      auVar111 = *(undefined1 (*) [32])(ray + 0x20);
      auVar122 = *(undefined1 (*) [32])(ray + 0x40);
      local_5de0 = vsubps_avx(auVar94,auVar128);
      local_5e00 = vsubps_avx(auVar120,auVar111);
      local_5e20 = vsubps_avx(auVar141,auVar122);
      auVar150 = vsubps_avx(local_5da0,auVar111);
      auVar151 = vsubps_avx(local_5dc0,auVar122);
      local_5cc0 = vsubps_avx(auVar150,local_5e00);
      local_5ca0 = vsubps_avx(auVar151,local_5e20);
      auVar166._0_4_ = auVar150._0_4_ + local_5e00._0_4_;
      auVar166._4_4_ = auVar150._4_4_ + local_5e00._4_4_;
      auVar166._8_4_ = auVar150._8_4_ + local_5e00._8_4_;
      auVar166._12_4_ = auVar150._12_4_ + local_5e00._12_4_;
      auVar166._16_4_ = auVar150._16_4_ + local_5e00._16_4_;
      auVar166._20_4_ = auVar150._20_4_ + local_5e00._20_4_;
      auVar166._24_4_ = auVar150._24_4_ + local_5e00._24_4_;
      auVar166._28_4_ = auVar150._28_4_ + local_5e00._28_4_;
      fVar119 = local_5e20._0_4_;
      auVar172._0_4_ = auVar151._0_4_ + fVar119;
      fVar104 = local_5e20._4_4_;
      auVar172._4_4_ = auVar151._4_4_ + fVar104;
      fVar106 = local_5e20._8_4_;
      auVar172._8_4_ = auVar151._8_4_ + fVar106;
      fVar8 = local_5e20._12_4_;
      auVar172._12_4_ = auVar151._12_4_ + fVar8;
      fVar9 = local_5e20._16_4_;
      auVar172._16_4_ = auVar151._16_4_ + fVar9;
      fVar10 = local_5e20._20_4_;
      auVar172._20_4_ = auVar151._20_4_ + fVar10;
      fVar11 = local_5e20._24_4_;
      auVar172._24_4_ = auVar151._24_4_ + fVar11;
      auVar172._28_4_ = auVar151._28_4_ + local_5e20._28_4_;
      auVar117._0_4_ = auVar166._0_4_ * local_5ca0._0_4_;
      auVar117._4_4_ = auVar166._4_4_ * local_5ca0._4_4_;
      auVar117._8_4_ = auVar166._8_4_ * local_5ca0._8_4_;
      auVar117._12_4_ = auVar166._12_4_ * local_5ca0._12_4_;
      auVar117._16_4_ = auVar166._16_4_ * local_5ca0._16_4_;
      auVar117._20_4_ = auVar166._20_4_ * local_5ca0._20_4_;
      auVar117._28_36_ = auVar175._28_36_;
      auVar117._24_4_ = auVar166._24_4_ * local_5ca0._24_4_;
      auVar15 = vfmsub231ps_fma(auVar117._0_32_,local_5cc0,auVar172);
      auVar98 = vsubps_avx(local_5d80,auVar128);
      local_5ce0 = vsubps_avx(auVar98,local_5de0);
      auVar24._4_4_ = auVar172._4_4_ * local_5ce0._4_4_;
      auVar24._0_4_ = auVar172._0_4_ * local_5ce0._0_4_;
      auVar24._8_4_ = auVar172._8_4_ * local_5ce0._8_4_;
      auVar24._12_4_ = auVar172._12_4_ * local_5ce0._12_4_;
      auVar24._16_4_ = auVar172._16_4_ * local_5ce0._16_4_;
      auVar24._20_4_ = auVar172._20_4_ * local_5ce0._20_4_;
      auVar24._24_4_ = auVar172._24_4_ * local_5ce0._24_4_;
      auVar24._28_4_ = auVar172._28_4_;
      auVar178._0_4_ = auVar98._0_4_ + local_5de0._0_4_;
      auVar178._4_4_ = auVar98._4_4_ + local_5de0._4_4_;
      auVar178._8_4_ = auVar98._8_4_ + local_5de0._8_4_;
      auVar178._12_4_ = auVar98._12_4_ + local_5de0._12_4_;
      auVar178._16_4_ = auVar98._16_4_ + local_5de0._16_4_;
      auVar178._20_4_ = auVar98._20_4_ + local_5de0._20_4_;
      auVar178._24_4_ = auVar98._24_4_ + local_5de0._24_4_;
      fVar146 = auVar98._28_4_;
      auVar178._28_4_ = fVar146 + local_5de0._28_4_;
      auVar107 = vfmsub231ps_fma(auVar24,local_5ca0,auVar178);
      auVar25._4_4_ = auVar178._4_4_ * local_5cc0._4_4_;
      auVar25._0_4_ = auVar178._0_4_ * local_5cc0._0_4_;
      auVar25._8_4_ = auVar178._8_4_ * local_5cc0._8_4_;
      auVar25._12_4_ = auVar178._12_4_ * local_5cc0._12_4_;
      auVar25._16_4_ = auVar178._16_4_ * local_5cc0._16_4_;
      auVar25._20_4_ = auVar178._20_4_ * local_5cc0._20_4_;
      auVar25._24_4_ = auVar178._24_4_ * local_5cc0._24_4_;
      auVar25._28_4_ = auVar178._28_4_;
      auVar16 = vfmsub231ps_fma(auVar25,local_5ce0,auVar166);
      fVar118 = *(float *)(ray + 0xc0);
      fVar129 = *(float *)(ray + 0xc4);
      fVar131 = *(float *)(ray + 200);
      fVar133 = *(float *)(ray + 0xcc);
      fVar135 = *(float *)(ray + 0xd0);
      fVar137 = *(float *)(ray + 0xd4);
      fVar139 = *(float *)(ray + 0xd8);
      auVar75 = *(undefined1 (*) [28])(ray + 0xc0);
      auVar26._4_4_ = auVar16._4_4_ * fVar129;
      auVar26._0_4_ = auVar16._0_4_ * fVar118;
      auVar26._8_4_ = auVar16._8_4_ * fVar131;
      auVar26._12_4_ = auVar16._12_4_ * fVar133;
      auVar26._16_4_ = fVar135 * 0.0;
      auVar26._20_4_ = fVar137 * 0.0;
      auVar26._24_4_ = fVar139 * 0.0;
      auVar26._28_4_ = auVar166._28_4_;
      auVar147 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar107 = vfmadd231ps_fma(auVar26,auVar147,ZEXT1632(auVar107));
      uVar78 = (ulong)*(uint *)(lVar83 + -0x40 + uVar82 * 4);
      fVar87 = pfVar4[uVar78];
      local_5840._4_4_ = fVar87;
      local_5840._0_4_ = fVar87;
      local_5840._8_4_ = fVar87;
      local_5840._12_4_ = fVar87;
      local_5840._16_4_ = fVar87;
      local_5840._20_4_ = fVar87;
      local_5840._24_4_ = fVar87;
      local_5840._28_4_ = fVar87;
      local_5d00 = *(undefined1 (*) [32])(ray + 0x80);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_5d00,ZEXT1632(auVar15));
      auVar165 = vsubps_avx(local_5840,auVar128);
      fVar87 = pfVar4[uVar78 + 1];
      local_5860._4_4_ = fVar87;
      local_5860._0_4_ = fVar87;
      local_5860._8_4_ = fVar87;
      local_5860._12_4_ = fVar87;
      local_5860._16_4_ = fVar87;
      local_5860._20_4_ = fVar87;
      local_5860._24_4_ = fVar87;
      local_5860._28_4_ = fVar87;
      auVar111 = vsubps_avx(local_5860,auVar111);
      fVar87 = pfVar4[uVar78 + 2];
      local_5880._4_4_ = fVar87;
      local_5880._0_4_ = fVar87;
      local_5880._8_4_ = fVar87;
      local_5880._12_4_ = fVar87;
      local_5880._16_4_ = fVar87;
      local_5880._20_4_ = fVar87;
      local_5880._24_4_ = fVar87;
      local_5880._28_4_ = fVar87;
      auVar122 = vsubps_avx(local_5880,auVar122);
      local_5d20 = vsubps_avx(local_5e00,auVar111);
      local_5d40 = vsubps_avx(local_5e20,auVar122);
      auVar148._0_4_ = local_5e00._0_4_ + auVar111._0_4_;
      auVar148._4_4_ = local_5e00._4_4_ + auVar111._4_4_;
      auVar148._8_4_ = local_5e00._8_4_ + auVar111._8_4_;
      auVar148._12_4_ = local_5e00._12_4_ + auVar111._12_4_;
      auVar148._16_4_ = local_5e00._16_4_ + auVar111._16_4_;
      auVar148._20_4_ = local_5e00._20_4_ + auVar111._20_4_;
      auVar148._24_4_ = local_5e00._24_4_ + auVar111._24_4_;
      auVar148._28_4_ = local_5e00._28_4_ + auVar111._28_4_;
      auVar161._0_4_ = fVar119 + auVar122._0_4_;
      auVar161._4_4_ = fVar104 + auVar122._4_4_;
      auVar161._8_4_ = fVar106 + auVar122._8_4_;
      auVar161._12_4_ = fVar8 + auVar122._12_4_;
      auVar161._16_4_ = fVar9 + auVar122._16_4_;
      auVar161._20_4_ = fVar10 + auVar122._20_4_;
      auVar161._24_4_ = fVar11 + auVar122._24_4_;
      auVar161._28_4_ = local_5e20._28_4_ + auVar122._28_4_;
      fVar177 = local_5d40._0_4_;
      fVar180 = local_5d40._4_4_;
      auVar27._4_4_ = fVar180 * auVar148._4_4_;
      auVar27._0_4_ = fVar177 * auVar148._0_4_;
      fVar181 = local_5d40._8_4_;
      auVar27._8_4_ = fVar181 * auVar148._8_4_;
      fVar182 = local_5d40._12_4_;
      auVar27._12_4_ = fVar182 * auVar148._12_4_;
      fVar183 = local_5d40._16_4_;
      auVar27._16_4_ = fVar183 * auVar148._16_4_;
      fVar184 = local_5d40._20_4_;
      auVar27._20_4_ = fVar184 * auVar148._20_4_;
      fVar185 = local_5d40._24_4_;
      auVar27._24_4_ = fVar185 * auVar148._24_4_;
      auVar27._28_4_ = auVar128._28_4_;
      auVar16 = vfmsub231ps_fma(auVar27,local_5d20,auVar161);
      auVar112 = vsubps_avx(local_5de0,auVar165);
      fVar87 = auVar112._0_4_;
      fVar102 = auVar112._4_4_;
      auVar28._4_4_ = auVar161._4_4_ * fVar102;
      auVar28._0_4_ = auVar161._0_4_ * fVar87;
      fVar103 = auVar112._8_4_;
      auVar28._8_4_ = auVar161._8_4_ * fVar103;
      fVar105 = auVar112._12_4_;
      auVar28._12_4_ = auVar161._12_4_ * fVar105;
      fVar12 = auVar112._16_4_;
      auVar28._16_4_ = auVar161._16_4_ * fVar12;
      fVar13 = auVar112._20_4_;
      auVar28._20_4_ = auVar161._20_4_ * fVar13;
      fVar14 = auVar112._24_4_;
      auVar28._24_4_ = auVar161._24_4_ * fVar14;
      auVar28._28_4_ = auVar161._28_4_;
      auVar154._0_4_ = local_5de0._0_4_ + auVar165._0_4_;
      auVar154._4_4_ = local_5de0._4_4_ + auVar165._4_4_;
      auVar154._8_4_ = local_5de0._8_4_ + auVar165._8_4_;
      auVar154._12_4_ = local_5de0._12_4_ + auVar165._12_4_;
      auVar154._16_4_ = local_5de0._16_4_ + auVar165._16_4_;
      auVar154._20_4_ = local_5de0._20_4_ + auVar165._20_4_;
      auVar154._24_4_ = local_5de0._24_4_ + auVar165._24_4_;
      auVar154._28_4_ = local_5de0._28_4_ + auVar165._28_4_;
      auVar159 = ZEXT3264(local_5e60);
      auVar15 = vfmsub231ps_fma(auVar28,local_5d40,auVar154);
      fVar130 = local_5d20._0_4_;
      fVar132 = local_5d20._4_4_;
      auVar29._4_4_ = fVar132 * auVar154._4_4_;
      auVar29._0_4_ = fVar130 * auVar154._0_4_;
      fVar134 = local_5d20._8_4_;
      auVar29._8_4_ = fVar134 * auVar154._8_4_;
      fVar136 = local_5d20._12_4_;
      auVar29._12_4_ = fVar136 * auVar154._12_4_;
      fVar138 = local_5d20._16_4_;
      auVar29._16_4_ = fVar138 * auVar154._16_4_;
      fVar140 = local_5d20._20_4_;
      auVar29._20_4_ = fVar140 * auVar154._20_4_;
      fVar176 = local_5d20._24_4_;
      auVar29._24_4_ = fVar176 * auVar154._24_4_;
      auVar29._28_4_ = auVar154._28_4_;
      auVar17 = vfmsub231ps_fma(auVar29,auVar112,auVar148);
      auVar30._4_4_ = fVar129 * auVar17._4_4_;
      auVar30._0_4_ = fVar118 * auVar17._0_4_;
      auVar30._8_4_ = fVar131 * auVar17._8_4_;
      auVar30._12_4_ = fVar133 * auVar17._12_4_;
      auVar30._16_4_ = fVar135 * 0.0;
      auVar30._20_4_ = fVar137 * 0.0;
      auVar30._24_4_ = fVar139 * 0.0;
      auVar30._28_4_ = auVar148._28_4_;
      auVar15 = vfmadd231ps_fma(auVar30,auVar147,ZEXT1632(auVar15));
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_5d00,ZEXT1632(auVar16));
      auVar171 = vsubps_avx(auVar165,auVar98);
      auVar95._0_4_ = auVar165._0_4_ + auVar98._0_4_;
      auVar95._4_4_ = auVar165._4_4_ + auVar98._4_4_;
      auVar95._8_4_ = auVar165._8_4_ + auVar98._8_4_;
      auVar95._12_4_ = auVar165._12_4_ + auVar98._12_4_;
      auVar95._16_4_ = auVar165._16_4_ + auVar98._16_4_;
      auVar95._20_4_ = auVar165._20_4_ + auVar98._20_4_;
      auVar95._24_4_ = auVar165._24_4_ + auVar98._24_4_;
      auVar95._28_4_ = auVar165._28_4_ + fVar146;
      auVar98 = vsubps_avx(auVar111,auVar150);
      auVar109._0_4_ = auVar150._0_4_ + auVar111._0_4_;
      auVar109._4_4_ = auVar150._4_4_ + auVar111._4_4_;
      auVar109._8_4_ = auVar150._8_4_ + auVar111._8_4_;
      auVar109._12_4_ = auVar150._12_4_ + auVar111._12_4_;
      auVar109._16_4_ = auVar150._16_4_ + auVar111._16_4_;
      auVar109._20_4_ = auVar150._20_4_ + auVar111._20_4_;
      auVar109._24_4_ = auVar150._24_4_ + auVar111._24_4_;
      auVar109._28_4_ = auVar150._28_4_ + auVar111._28_4_;
      auVar165 = vsubps_avx(auVar122,auVar151);
      auVar121._0_4_ = auVar122._0_4_ + auVar151._0_4_;
      auVar121._4_4_ = auVar122._4_4_ + auVar151._4_4_;
      auVar121._8_4_ = auVar122._8_4_ + auVar151._8_4_;
      auVar121._12_4_ = auVar122._12_4_ + auVar151._12_4_;
      auVar121._16_4_ = auVar122._16_4_ + auVar151._16_4_;
      auVar121._20_4_ = auVar122._20_4_ + auVar151._20_4_;
      auVar121._24_4_ = auVar122._24_4_ + auVar151._24_4_;
      auVar121._28_4_ = auVar122._28_4_ + auVar151._28_4_;
      auVar31._4_4_ = auVar165._4_4_ * auVar109._4_4_;
      auVar31._0_4_ = auVar165._0_4_ * auVar109._0_4_;
      auVar31._8_4_ = auVar165._8_4_ * auVar109._8_4_;
      auVar31._12_4_ = auVar165._12_4_ * auVar109._12_4_;
      auVar31._16_4_ = auVar165._16_4_ * auVar109._16_4_;
      auVar31._20_4_ = auVar165._20_4_ * auVar109._20_4_;
      auVar31._24_4_ = auVar165._24_4_ * auVar109._24_4_;
      auVar31._28_4_ = fVar146;
      auVar17 = vfmsub231ps_fma(auVar31,auVar98,auVar121);
      auVar32._4_4_ = auVar171._4_4_ * auVar121._4_4_;
      auVar32._0_4_ = auVar171._0_4_ * auVar121._0_4_;
      auVar32._8_4_ = auVar171._8_4_ * auVar121._8_4_;
      auVar32._12_4_ = auVar171._12_4_ * auVar121._12_4_;
      auVar32._16_4_ = auVar171._16_4_ * auVar121._16_4_;
      auVar32._20_4_ = auVar171._20_4_ * auVar121._20_4_;
      auVar32._24_4_ = auVar171._24_4_ * auVar121._24_4_;
      auVar32._28_4_ = auVar121._28_4_;
      auVar16 = vfmsub231ps_fma(auVar32,auVar165,auVar95);
      auVar33._4_4_ = auVar98._4_4_ * auVar95._4_4_;
      auVar33._0_4_ = auVar98._0_4_ * auVar95._0_4_;
      auVar33._8_4_ = auVar98._8_4_ * auVar95._8_4_;
      auVar33._12_4_ = auVar98._12_4_ * auVar95._12_4_;
      auVar33._16_4_ = auVar98._16_4_ * auVar95._16_4_;
      auVar33._20_4_ = auVar98._20_4_ * auVar95._20_4_;
      auVar33._24_4_ = auVar98._24_4_ * auVar95._24_4_;
      auVar33._28_4_ = auVar95._28_4_;
      auVar18 = vfmsub231ps_fma(auVar33,auVar171,auVar109);
      auVar96._0_4_ = fVar118 * auVar18._0_4_;
      auVar96._4_4_ = fVar129 * auVar18._4_4_;
      auVar96._8_4_ = fVar131 * auVar18._8_4_;
      auVar96._12_4_ = fVar133 * auVar18._12_4_;
      auVar96._16_4_ = fVar135 * 0.0;
      auVar96._20_4_ = fVar137 * 0.0;
      auVar96._24_4_ = fVar139 * 0.0;
      auVar96._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar96,auVar147,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_5d00,ZEXT1632(auVar17));
      auVar151 = ZEXT1632(CONCAT412(auVar16._12_4_ + auVar107._12_4_ + auVar15._12_4_,
                                    CONCAT48(auVar16._8_4_ + auVar107._8_4_ + auVar15._8_4_,
                                             CONCAT44(auVar16._4_4_ + auVar107._4_4_ + auVar15._4_4_
                                                      ,auVar16._0_4_ +
                                                       auVar107._0_4_ + auVar15._0_4_))));
      auVar152 = ZEXT3264(auVar151);
      local_5900 = ZEXT1632(auVar107);
      auVar128 = vminps_avx(local_5900,ZEXT1632(auVar15));
      auVar111 = vminps_avx(auVar128,ZEXT1632(auVar16));
      auVar128 = vandps_avx(auVar151,local_5e60);
      fVar118 = auVar128._0_4_ * 1.1920929e-07;
      fVar129 = auVar128._4_4_ * 1.1920929e-07;
      auVar34._4_4_ = fVar129;
      auVar34._0_4_ = fVar118;
      fVar131 = auVar128._8_4_ * 1.1920929e-07;
      auVar34._8_4_ = fVar131;
      fVar133 = auVar128._12_4_ * 1.1920929e-07;
      auVar34._12_4_ = fVar133;
      fVar135 = auVar128._16_4_ * 1.1920929e-07;
      auVar34._16_4_ = fVar135;
      fVar137 = auVar128._20_4_ * 1.1920929e-07;
      auVar34._20_4_ = fVar137;
      fVar139 = auVar128._24_4_ * 1.1920929e-07;
      auVar34._24_4_ = fVar139;
      auVar34._28_4_ = 0x34000000;
      auVar174._8_4_ = 0x80000000;
      auVar174._0_8_ = 0x8000000080000000;
      auVar174._12_4_ = 0x80000000;
      auVar174._16_4_ = 0x80000000;
      auVar174._20_4_ = 0x80000000;
      auVar174._24_4_ = 0x80000000;
      auVar174._28_4_ = 0x80000000;
      auVar142._0_8_ = CONCAT44(fVar129,fVar118) ^ 0x8000000080000000;
      auVar142._8_4_ = -fVar131;
      auVar142._12_4_ = -fVar133;
      auVar142._16_4_ = -fVar135;
      auVar142._20_4_ = -fVar137;
      auVar142._24_4_ = -fVar139;
      auVar142._28_4_ = 0xb4000000;
      auVar111 = vcmpps_avx(auVar111,auVar142,5);
      auVar150 = vmaxps_avx(local_5900,ZEXT1632(auVar15));
      auVar122 = vmaxps_avx(auVar150,ZEXT1632(auVar16));
      auVar122 = vcmpps_avx(auVar122,auVar34,2);
      auVar111 = vorps_avx(auVar111,auVar122);
      uVar78 = (ulong)*(uint *)(lVar83 + -0x30 + uVar82 * 4);
      auVar122 = local_5f40 & auVar111;
      local_58a0 = pfVar4[uVar78];
      local_58c0 = pfVar4[uVar78 + 1];
      local_58e0 = pfVar4[uVar78 + 2];
      fStack_58dc = local_58e0;
      fStack_58d8 = local_58e0;
      fStack_58d4 = local_58e0;
      fStack_58d0 = local_58e0;
      fStack_58cc = local_58e0;
      fStack_58c8 = local_58e0;
      fStack_58c4 = local_58e0;
      fStack_58bc = local_58c0;
      fStack_58b8 = local_58c0;
      fStack_58b4 = local_58c0;
      fStack_58b0 = local_58c0;
      fStack_58ac = local_58c0;
      fStack_58a8 = local_58c0;
      fStack_58a4 = local_58c0;
      fStack_589c = local_58a0;
      fStack_5898 = local_58a0;
      fStack_5894 = local_58a0;
      fStack_5890 = local_58a0;
      fStack_588c = local_58a0;
      fStack_5888 = local_58a0;
      fStack_5884 = local_58a0;
      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0x7f,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0xbf,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar122[0x1f]) {
LAB_00695383:
        auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar167 = ZEXT3264(auVar174);
        _local_5f20 = auVar147;
      }
      else {
        auVar35._4_4_ = fVar132 * local_5ca0._4_4_;
        auVar35._0_4_ = fVar130 * local_5ca0._0_4_;
        auVar35._8_4_ = fVar134 * local_5ca0._8_4_;
        auVar35._12_4_ = fVar136 * local_5ca0._12_4_;
        auVar35._16_4_ = fVar138 * local_5ca0._16_4_;
        auVar35._20_4_ = fVar140 * local_5ca0._20_4_;
        auVar35._24_4_ = fVar176 * local_5ca0._24_4_;
        auVar35._28_4_ = local_58e0;
        auVar36._4_4_ = fVar102 * local_5cc0._4_4_;
        auVar36._0_4_ = fVar87 * local_5cc0._0_4_;
        auVar36._8_4_ = fVar103 * local_5cc0._8_4_;
        auVar36._12_4_ = fVar105 * local_5cc0._12_4_;
        auVar36._16_4_ = fVar12 * local_5cc0._16_4_;
        auVar36._20_4_ = fVar13 * local_5cc0._20_4_;
        auVar36._24_4_ = fVar14 * local_5cc0._24_4_;
        auVar36._28_4_ = auVar111._28_4_;
        auVar16 = vfmsub213ps_fma(local_5cc0,local_5d40,auVar35);
        auVar37._4_4_ = auVar98._4_4_ * fVar180;
        auVar37._0_4_ = auVar98._0_4_ * fVar177;
        auVar37._8_4_ = auVar98._8_4_ * fVar181;
        auVar37._12_4_ = auVar98._12_4_ * fVar182;
        auVar37._16_4_ = auVar98._16_4_ * fVar183;
        auVar37._20_4_ = auVar98._20_4_ * fVar184;
        auVar37._24_4_ = auVar98._24_4_ * fVar185;
        auVar37._28_4_ = 0x34000000;
        auVar38._4_4_ = fVar102 * auVar165._4_4_;
        auVar38._0_4_ = fVar87 * auVar165._0_4_;
        auVar38._8_4_ = fVar103 * auVar165._8_4_;
        auVar38._12_4_ = fVar105 * auVar165._12_4_;
        auVar38._16_4_ = fVar12 * auVar165._16_4_;
        auVar38._20_4_ = fVar13 * auVar165._20_4_;
        auVar38._24_4_ = fVar14 * auVar165._24_4_;
        auVar38._28_4_ = auVar150._28_4_;
        auVar17 = vfmsub213ps_fma(auVar165,local_5d20,auVar37);
        auVar122 = vandps_avx(auVar35,local_5e60);
        auVar150 = vandps_avx(auVar37,local_5e60);
        auVar122 = vcmpps_avx(auVar122,auVar150,1);
        auVar165 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar122);
        auVar39._4_4_ = auVar171._4_4_ * fVar132;
        auVar39._0_4_ = auVar171._0_4_ * fVar130;
        auVar39._8_4_ = auVar171._8_4_ * fVar134;
        auVar39._12_4_ = auVar171._12_4_ * fVar136;
        auVar39._16_4_ = auVar171._16_4_ * fVar138;
        auVar39._20_4_ = auVar171._20_4_ * fVar140;
        auVar39._24_4_ = auVar171._24_4_ * fVar176;
        auVar39._28_4_ = auVar122._28_4_;
        auVar16 = vfmsub213ps_fma(auVar171,local_5d40,auVar38);
        auVar40._4_4_ = fVar180 * local_5ce0._4_4_;
        auVar40._0_4_ = fVar177 * local_5ce0._0_4_;
        auVar40._8_4_ = fVar181 * local_5ce0._8_4_;
        auVar40._12_4_ = fVar182 * local_5ce0._12_4_;
        auVar40._16_4_ = fVar183 * local_5ce0._16_4_;
        auVar40._20_4_ = fVar184 * local_5ce0._20_4_;
        auVar40._24_4_ = fVar185 * local_5ce0._24_4_;
        auVar40._28_4_ = auVar150._28_4_;
        auVar17 = vfmsub213ps_fma(local_5ca0,auVar112,auVar40);
        auVar122 = vandps_avx(auVar40,local_5e60);
        auVar150 = vandps_avx(auVar38,local_5e60);
        auVar122 = vcmpps_avx(auVar122,auVar150,1);
        auVar171 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17),auVar122);
        auVar152 = ZEXT3264(auVar171);
        auVar16 = vfmsub213ps_fma(local_5ce0,local_5d20,auVar36);
        auVar17 = vfmsub213ps_fma(auVar98,auVar112,auVar39);
        auVar122 = vandps_avx(auVar36,local_5e60);
        auVar150 = vandps_avx(auVar39,local_5e60);
        auVar150 = vcmpps_avx(auVar122,auVar150,1);
        auVar98 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar150);
        local_5f80._0_4_ = auVar75._0_4_;
        local_5f80._4_4_ = auVar75._4_4_;
        fStack_5f78 = auVar75._8_4_;
        fStack_5f74 = auVar75._12_4_;
        fStack_5f70 = auVar75._16_4_;
        fStack_5f6c = auVar75._20_4_;
        fStack_5f68 = auVar75._24_4_;
        auVar41._4_4_ = auVar98._4_4_ * (float)local_5f80._4_4_;
        auVar41._0_4_ = auVar98._0_4_ * (float)local_5f80._0_4_;
        auVar41._8_4_ = auVar98._8_4_ * fStack_5f78;
        auVar41._12_4_ = auVar98._12_4_ * fStack_5f74;
        auVar41._16_4_ = auVar98._16_4_ * fStack_5f70;
        auVar41._20_4_ = auVar98._20_4_ * fStack_5f6c;
        auVar41._24_4_ = auVar98._24_4_ * fStack_5f68;
        auVar41._28_4_ = auVar150._28_4_;
        auVar16 = vfmadd213ps_fma(auVar147,auVar171,auVar41);
        auVar16 = vfmadd213ps_fma(local_5d00,auVar165,ZEXT1632(auVar16));
        fVar87 = auVar16._0_4_ + auVar16._0_4_;
        fVar102 = auVar16._4_4_ + auVar16._4_4_;
        fVar103 = auVar16._8_4_ + auVar16._8_4_;
        fVar105 = auVar16._12_4_ + auVar16._12_4_;
        auVar123 = ZEXT1632(CONCAT412(fVar105,CONCAT48(fVar103,CONCAT44(fVar102,fVar87))));
        auVar42._4_4_ = auVar98._4_4_ * fVar104;
        auVar42._0_4_ = auVar98._0_4_ * fVar119;
        auVar42._8_4_ = auVar98._8_4_ * fVar106;
        auVar42._12_4_ = auVar98._12_4_ * fVar8;
        auVar42._16_4_ = auVar98._16_4_ * fVar9;
        auVar42._20_4_ = auVar98._20_4_ * fVar10;
        auVar42._24_4_ = auVar98._24_4_ * fVar11;
        auVar42._28_4_ = auVar122._28_4_;
        auVar16 = vfmadd213ps_fma(local_5e00,auVar171,auVar42);
        auVar17 = vfmadd213ps_fma(local_5de0,auVar165,ZEXT1632(auVar16));
        auVar122 = vrcpps_avx(auVar123);
        auVar162._8_4_ = 0x3f800000;
        auVar162._0_8_ = &DAT_3f8000003f800000;
        auVar162._12_4_ = 0x3f800000;
        auVar162._16_4_ = 0x3f800000;
        auVar162._20_4_ = 0x3f800000;
        auVar162._24_4_ = 0x3f800000;
        auVar162._28_4_ = 0x3f800000;
        auVar16 = vfnmadd213ps_fma(auVar122,auVar123,auVar162);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar122,auVar122);
        auVar112 = ZEXT1632(CONCAT412((auVar17._12_4_ + auVar17._12_4_) * auVar16._12_4_,
                                      CONCAT48((auVar17._8_4_ + auVar17._8_4_) * auVar16._8_4_,
                                               CONCAT44((auVar17._4_4_ + auVar17._4_4_) *
                                                        auVar16._4_4_,
                                                        (auVar17._0_4_ + auVar17._0_4_) *
                                                        auVar16._0_4_))));
        _local_5f20 = *(undefined1 (*) [32])(ray + 0x100);
        auVar122 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar112,2);
        auVar150 = vcmpps_avx(auVar112,_local_5f20,2);
        auVar122 = vandps_avx(auVar122,auVar150);
        auVar143._0_8_ = CONCAT44(fVar102,fVar87) ^ 0x8000000080000000;
        auVar143._8_4_ = -fVar103;
        auVar143._12_4_ = -fVar105;
        auVar143._16_4_ = 0x80000000;
        auVar143._20_4_ = 0x80000000;
        auVar143._24_4_ = 0x80000000;
        auVar143._28_4_ = 0x80000000;
        auVar150 = vcmpps_avx(auVar123,auVar143,4);
        auVar122 = vandps_avx(auVar150,auVar122);
        auVar150 = vandps_avx(auVar111,local_5f40);
        auVar122 = vpslld_avx2(auVar122,0x1f);
        auVar123 = vpsrad_avx2(auVar122,0x1f);
        auVar122 = auVar150 & auVar123;
        auVar167 = ZEXT3264(auVar174);
        local_5d60 = auVar111;
        local_5940 = auVar128;
        local_5920 = auVar151;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) goto LAB_00695383;
        auVar111 = vandps_avx(auVar123,auVar150);
        pGVar5 = (context->scene->geometries).items[uVar3].ptr;
        uVar2 = pGVar5->mask;
        auVar124._4_4_ = uVar2;
        auVar124._0_4_ = uVar2;
        auVar124._8_4_ = uVar2;
        auVar124._12_4_ = uVar2;
        auVar124._16_4_ = uVar2;
        auVar124._20_4_ = uVar2;
        auVar124._24_4_ = uVar2;
        auVar124._28_4_ = uVar2;
        auVar122 = vpand_avx2(auVar124,*(undefined1 (*) [32])(ray + 0x120));
        auVar150 = vpcmpeqd_avx2(auVar122,_DAT_02020f00);
        auVar122 = auVar111 & ~auVar150;
        uVar84 = local_5f88;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) goto LAB_00695383;
        auVar111 = vandnps_avx(auVar150,auVar111);
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          _local_5f20 = auVar147;
        }
        else {
          auVar122 = vrcpps_avx(auVar151);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = &DAT_3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar158._16_4_ = 0x3f800000;
          auVar158._20_4_ = 0x3f800000;
          auVar158._24_4_ = 0x3f800000;
          auVar158._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar151,auVar122,auVar158);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar122,auVar122);
          auVar99._8_4_ = 0x219392ef;
          auVar99._0_8_ = 0x219392ef219392ef;
          auVar99._12_4_ = 0x219392ef;
          auVar99._16_4_ = 0x219392ef;
          auVar99._20_4_ = 0x219392ef;
          auVar99._24_4_ = 0x219392ef;
          auVar99._28_4_ = 0x219392ef;
          auVar122 = vcmpps_avx(auVar128,auVar99,5);
          auVar122 = vandps_avx(ZEXT1632(auVar16),auVar122);
          auVar62._4_4_ = auVar122._4_4_ * auVar107._4_4_;
          auVar62._0_4_ = auVar122._0_4_ * auVar107._0_4_;
          auVar62._8_4_ = auVar122._8_4_ * auVar107._8_4_;
          auVar62._12_4_ = auVar122._12_4_ * auVar107._12_4_;
          auVar62._16_4_ = auVar122._16_4_ * 0.0;
          auVar62._20_4_ = auVar122._20_4_ * 0.0;
          auVar62._24_4_ = auVar122._24_4_ * 0.0;
          auVar62._28_4_ = auVar128._28_4_;
          auVar128 = vminps_avx(auVar62,auVar158);
          auVar63._4_4_ = auVar15._4_4_ * auVar122._4_4_;
          auVar63._0_4_ = auVar15._0_4_ * auVar122._0_4_;
          auVar63._8_4_ = auVar15._8_4_ * auVar122._8_4_;
          auVar63._12_4_ = auVar15._12_4_ * auVar122._12_4_;
          auVar63._16_4_ = auVar122._16_4_ * 0.0;
          auVar63._20_4_ = auVar122._20_4_ * 0.0;
          auVar63._24_4_ = auVar122._24_4_ * 0.0;
          auVar63._28_4_ = auVar122._28_4_;
          auVar122 = vminps_avx(auVar63,auVar158);
          auVar150 = vsubps_avx(auVar158,auVar128);
          auVar151 = vsubps_avx(auVar158,auVar122);
          auVar107._8_8_ = uStack_5978;
          auVar107._0_8_ = local_5980;
          auVar71._16_8_ = uStack_5970;
          auVar71._0_16_ = auVar107;
          auVar71._24_8_ = uStack_5968;
          auVar159 = ZEXT3264(auVar71);
          local_5c20 = vblendvps_avx(auVar128,auVar150,auVar71);
          local_5c00 = vblendvps_avx(auVar122,auVar151,auVar71);
          pRVar6 = context->user;
          local_5be0._4_4_ = iVar76;
          local_5be0._0_4_ = iVar76;
          local_5be0._8_4_ = iVar76;
          local_5be0._12_4_ = iVar76;
          local_5be0._16_4_ = iVar76;
          local_5be0._20_4_ = iVar76;
          local_5be0._24_4_ = iVar76;
          local_5be0._28_4_ = iVar76;
          auVar122 = vpcmpeqd_avx2(local_5c20,local_5c20);
          local_5ef8[1] = auVar122;
          *local_5ef8 = auVar122;
          local_5ba0 = pRVar6->instID[0];
          local_5b80 = pRVar6->instPrimID[0];
          auVar128 = vblendvps_avx(_local_5f20,auVar112,auVar111);
          *(undefined1 (*) [32])(ray + 0x100) = auVar128;
          local_5ef0.valid = (int *)local_5ea0;
          local_5ef0.geometryUserPtr = pGVar5->userPtr;
          local_5ef0.context = context->user;
          local_5ef0.hit = local_5c80;
          local_5ef0.N = 8;
          local_5ef0.ray = (RTCRayN *)ray;
          local_5ea0 = auVar111;
          local_5c80 = (RTCHitN  [32])auVar165;
          local_5c60 = auVar171;
          local_5c40 = auVar98;
          local_5bc0 = uVar3;
          uStack_5bbc = uVar3;
          uStack_5bb8 = uVar3;
          uStack_5bb4 = uVar3;
          uStack_5bb0 = uVar3;
          uStack_5bac = uVar3;
          uStack_5ba8 = uVar3;
          uStack_5ba4 = uVar3;
          uStack_5b9c = local_5ba0;
          uStack_5b98 = local_5ba0;
          uStack_5b94 = local_5ba0;
          uStack_5b90 = local_5ba0;
          uStack_5b8c = local_5ba0;
          uStack_5b88 = local_5ba0;
          uStack_5b84 = local_5ba0;
          uStack_5b7c = local_5b80;
          uStack_5b78 = local_5b80;
          uStack_5b74 = local_5b80;
          uStack_5b70 = local_5b80;
          uStack_5b6c = local_5b80;
          uStack_5b68 = local_5b80;
          uStack_5b64 = local_5b80;
          auVar128 = _local_5f20;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar128 = ZEXT1632(auVar122._0_16_);
            auVar152 = ZEXT1664(auVar171._0_16_);
            auVar159 = ZEXT1664(auVar107);
            _local_5f80 = auVar174;
            local_5f50 = ray;
            (*pGVar5->occlusionFilterN)(&local_5ef0);
            auVar167 = ZEXT3264(_local_5f80);
            auVar122 = vpcmpeqd_avx2(auVar128,auVar128);
            ray = local_5f50;
            auVar147 = _local_5f20;
            auVar128 = _local_5f20;
          }
          _local_5f20 = auVar147;
          auVar111 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_5ea0);
          auVar147 = auVar122 & ~auVar111;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar147[0x1f]) {
            auVar111 = auVar111 ^ auVar122;
            auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
          }
          else {
            p_Var7 = context->args->filter;
            auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              _local_5f80 = auVar167._0_32_;
              auVar111 = ZEXT1632(auVar122._0_16_);
              auVar152 = ZEXT1664(auVar152._0_16_);
              auVar159 = ZEXT1664(auVar159._0_16_);
              _local_5f20 = auVar128;
              (*p_Var7)(&local_5ef0);
              auVar167 = ZEXT3264(_local_5f80);
              auVar122 = vpcmpeqd_avx2(auVar111,auVar111);
              auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar128 = _local_5f20;
            }
            auVar147 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_5ea0);
            auVar111 = auVar147 ^ auVar122;
            auVar114._8_4_ = 0xff800000;
            auVar114._0_8_ = 0xff800000ff800000;
            auVar114._12_4_ = 0xff800000;
            auVar114._16_4_ = 0xff800000;
            auVar114._20_4_ = 0xff800000;
            auVar114._24_4_ = 0xff800000;
            auVar114._28_4_ = 0xff800000;
            auVar122 = vblendvps_avx(auVar114,*(undefined1 (*) [32])(local_5ef0.ray + 0x100),
                                     auVar147);
            *(undefined1 (*) [32])(local_5ef0.ray + 0x100) = auVar122;
          }
          auVar128 = vblendvps_avx(auVar128,*(undefined1 (*) [32])local_5f48,auVar111);
          *(undefined1 (*) [32])local_5f48 = auVar128;
        }
        local_5f40 = vandnps_avx(auVar111,local_5f40);
        uVar84 = local_5f88;
      }
      if ((((((((local_5f40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5f40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5f40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5f40 >> 0x7f,0) == '\0') &&
            (local_5f40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5f40 >> 0xbf,0) == '\0') &&
          (local_5f40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5f40[0x1f]) {
        bVar86 = false;
      }
      else {
        auVar128 = *(undefined1 (*) [32])ray;
        auVar111 = *(undefined1 (*) [32])(ray + 0x20);
        auVar122 = *(undefined1 (*) [32])(ray + 0x40);
        auVar74._4_4_ = fStack_589c;
        auVar74._0_4_ = local_58a0;
        auVar74._8_4_ = fStack_5898;
        auVar74._12_4_ = fStack_5894;
        auVar74._16_4_ = fStack_5890;
        auVar74._20_4_ = fStack_588c;
        auVar74._24_4_ = fStack_5888;
        auVar74._28_4_ = fStack_5884;
        local_5ca0 = vsubps_avx(auVar74,auVar128);
        auVar73._4_4_ = fStack_58bc;
        auVar73._0_4_ = local_58c0;
        auVar73._8_4_ = fStack_58b8;
        auVar73._12_4_ = fStack_58b4;
        auVar73._16_4_ = fStack_58b0;
        auVar73._20_4_ = fStack_58ac;
        auVar73._24_4_ = fStack_58a8;
        auVar73._28_4_ = fStack_58a4;
        local_5cc0 = vsubps_avx(auVar73,auVar111);
        auVar72._4_4_ = fStack_58dc;
        auVar72._0_4_ = local_58e0;
        auVar72._8_4_ = fStack_58d8;
        auVar72._12_4_ = fStack_58d4;
        auVar72._16_4_ = fStack_58d0;
        auVar72._20_4_ = fStack_58cc;
        auVar72._24_4_ = fStack_58c8;
        auVar72._28_4_ = fStack_58c4;
        local_5ce0 = vsubps_avx(auVar72,auVar122);
        auVar98 = vsubps_avx(local_5d80,auVar128);
        auVar147 = vsubps_avx(local_5da0,auVar111);
        auVar150 = vsubps_avx(local_5dc0,auVar122);
        auVar151 = vsubps_avx(local_5840,auVar128);
        auVar165 = vsubps_avx(local_5860,auVar111);
        auVar122 = vsubps_avx(local_5880,auVar122);
        local_5d00 = vsubps_avx(auVar151,local_5ca0);
        local_5d40 = vsubps_avx(auVar165,local_5cc0);
        local_5d20 = vsubps_avx(auVar122,local_5ce0);
        auVar163._0_4_ = auVar151._0_4_ + local_5ca0._0_4_;
        auVar163._4_4_ = auVar151._4_4_ + local_5ca0._4_4_;
        auVar163._8_4_ = auVar151._8_4_ + local_5ca0._8_4_;
        auVar163._12_4_ = auVar151._12_4_ + local_5ca0._12_4_;
        auVar163._16_4_ = auVar151._16_4_ + local_5ca0._16_4_;
        auVar163._20_4_ = auVar151._20_4_ + local_5ca0._20_4_;
        auVar163._24_4_ = auVar151._24_4_ + local_5ca0._24_4_;
        auVar163._28_4_ = auVar151._28_4_ + local_5ca0._28_4_;
        auVar169._0_4_ = auVar165._0_4_ + local_5cc0._0_4_;
        auVar169._4_4_ = auVar165._4_4_ + local_5cc0._4_4_;
        auVar169._8_4_ = auVar165._8_4_ + local_5cc0._8_4_;
        auVar169._12_4_ = auVar165._12_4_ + local_5cc0._12_4_;
        auVar169._16_4_ = auVar165._16_4_ + local_5cc0._16_4_;
        auVar169._20_4_ = auVar165._20_4_ + local_5cc0._20_4_;
        auVar169._24_4_ = auVar165._24_4_ + local_5cc0._24_4_;
        fVar87 = local_5cc0._28_4_;
        auVar169._28_4_ = auVar165._28_4_ + fVar87;
        fVar177 = local_5ce0._0_4_;
        auVar173._0_4_ = fVar177 + auVar122._0_4_;
        fVar180 = local_5ce0._4_4_;
        auVar173._4_4_ = fVar180 + auVar122._4_4_;
        fVar181 = local_5ce0._8_4_;
        auVar173._8_4_ = fVar181 + auVar122._8_4_;
        fVar182 = local_5ce0._12_4_;
        auVar173._12_4_ = fVar182 + auVar122._12_4_;
        fVar183 = local_5ce0._16_4_;
        auVar173._16_4_ = fVar183 + auVar122._16_4_;
        fVar184 = local_5ce0._20_4_;
        auVar173._20_4_ = fVar184 + auVar122._20_4_;
        fVar185 = local_5ce0._24_4_;
        auVar173._24_4_ = fVar185 + auVar122._24_4_;
        auVar173._28_4_ = local_5ce0._28_4_ + auVar122._28_4_;
        auVar66._4_4_ = auVar169._4_4_ * local_5d20._4_4_;
        auVar66._0_4_ = auVar169._0_4_ * local_5d20._0_4_;
        auVar66._8_4_ = auVar169._8_4_ * local_5d20._8_4_;
        auVar66._12_4_ = auVar169._12_4_ * local_5d20._12_4_;
        auVar66._16_4_ = auVar169._16_4_ * local_5d20._16_4_;
        auVar66._20_4_ = auVar169._20_4_ * local_5d20._20_4_;
        auVar66._24_4_ = auVar169._24_4_ * local_5d20._24_4_;
        auVar66._28_4_ = local_5e60._28_4_;
        auVar15 = vfmsub231ps_fma(auVar66,local_5d40,auVar173);
        auVar43._4_4_ = auVar173._4_4_ * local_5d00._4_4_;
        auVar43._0_4_ = auVar173._0_4_ * local_5d00._0_4_;
        auVar43._8_4_ = auVar173._8_4_ * local_5d00._8_4_;
        auVar43._12_4_ = auVar173._12_4_ * local_5d00._12_4_;
        auVar43._16_4_ = auVar173._16_4_ * local_5d00._16_4_;
        auVar43._20_4_ = auVar173._20_4_ * local_5d00._20_4_;
        auVar43._24_4_ = auVar173._24_4_ * local_5d00._24_4_;
        auVar43._28_4_ = auVar173._28_4_;
        auVar107 = vfmsub231ps_fma(auVar43,local_5d20,auVar163);
        auVar44._4_4_ = auVar163._4_4_ * local_5d40._4_4_;
        auVar44._0_4_ = auVar163._0_4_ * local_5d40._0_4_;
        auVar44._8_4_ = auVar163._8_4_ * local_5d40._8_4_;
        auVar44._12_4_ = auVar163._12_4_ * local_5d40._12_4_;
        auVar44._16_4_ = auVar163._16_4_ * local_5d40._16_4_;
        auVar44._20_4_ = auVar163._20_4_ * local_5d40._20_4_;
        auVar44._24_4_ = auVar163._24_4_ * local_5d40._24_4_;
        auVar44._28_4_ = auVar163._28_4_;
        auVar16 = vfmsub231ps_fma(auVar44,local_5d00,auVar169);
        pRVar1 = ray + 0xc0;
        fVar130 = *(float *)pRVar1;
        fVar132 = *(float *)(ray + 0xc4);
        fVar134 = *(float *)(ray + 200);
        fVar136 = *(float *)(ray + 0xcc);
        fVar138 = *(float *)(ray + 0xd0);
        fVar140 = *(float *)(ray + 0xd4);
        fVar176 = *(float *)(ray + 0xd8);
        auVar75 = *(undefined1 (*) [28])pRVar1;
        auVar108 = *(undefined1 (*) [32])pRVar1;
        auVar152._0_4_ = auVar16._0_4_ * fVar130;
        auVar152._4_4_ = auVar16._4_4_ * fVar132;
        auVar152._8_4_ = auVar16._8_4_ * fVar134;
        auVar152._12_4_ = auVar16._12_4_ * fVar136;
        auVar152._16_4_ = fVar138 * 0.0;
        auVar152._20_4_ = fVar140 * 0.0;
        auVar152._28_36_ = auVar167._28_36_;
        auVar152._24_4_ = fVar176 * 0.0;
        auVar128 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar107 = vfmadd231ps_fma(auVar152._0_32_,auVar128,ZEXT1632(auVar107));
        auVar111 = *(undefined1 (*) [32])(ray + 0x80);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar111,ZEXT1632(auVar15));
        local_5d60 = vsubps_avx(local_5cc0,auVar147);
        local_5d80 = vsubps_avx(local_5ce0,auVar150);
        auVar164._0_4_ = auVar147._0_4_ + local_5cc0._0_4_;
        auVar164._4_4_ = auVar147._4_4_ + local_5cc0._4_4_;
        auVar164._8_4_ = auVar147._8_4_ + local_5cc0._8_4_;
        auVar164._12_4_ = auVar147._12_4_ + local_5cc0._12_4_;
        auVar164._16_4_ = auVar147._16_4_ + local_5cc0._16_4_;
        auVar164._20_4_ = auVar147._20_4_ + local_5cc0._20_4_;
        auVar164._24_4_ = auVar147._24_4_ + local_5cc0._24_4_;
        auVar164._28_4_ = auVar147._28_4_ + fVar87;
        auVar125._0_4_ = fVar177 + auVar150._0_4_;
        auVar125._4_4_ = fVar180 + auVar150._4_4_;
        auVar125._8_4_ = fVar181 + auVar150._8_4_;
        auVar125._12_4_ = fVar182 + auVar150._12_4_;
        auVar125._16_4_ = fVar183 + auVar150._16_4_;
        auVar125._20_4_ = fVar184 + auVar150._20_4_;
        auVar125._24_4_ = fVar185 + auVar150._24_4_;
        fVar119 = auVar150._28_4_;
        auVar125._28_4_ = local_5ce0._28_4_ + fVar119;
        fVar104 = local_5d80._0_4_;
        fVar8 = local_5d80._4_4_;
        auVar45._4_4_ = auVar164._4_4_ * fVar8;
        auVar45._0_4_ = auVar164._0_4_ * fVar104;
        fVar11 = local_5d80._8_4_;
        auVar45._8_4_ = auVar164._8_4_ * fVar11;
        fVar105 = local_5d80._12_4_;
        auVar45._12_4_ = auVar164._12_4_ * fVar105;
        fVar14 = local_5d80._16_4_;
        auVar45._16_4_ = auVar164._16_4_ * fVar14;
        fVar131 = local_5d80._20_4_;
        auVar45._20_4_ = auVar164._20_4_ * fVar131;
        fVar137 = local_5d80._24_4_;
        auVar45._24_4_ = auVar164._24_4_ * fVar137;
        auVar45._28_4_ = fVar87;
        auVar16 = vfmsub231ps_fma(auVar45,local_5d60,auVar125);
        local_5da0 = vsubps_avx(local_5ca0,auVar98);
        fVar87 = local_5da0._0_4_;
        fVar9 = local_5da0._4_4_;
        auVar46._4_4_ = auVar125._4_4_ * fVar9;
        auVar46._0_4_ = auVar125._0_4_ * fVar87;
        fVar102 = local_5da0._8_4_;
        auVar46._8_4_ = auVar125._8_4_ * fVar102;
        fVar12 = local_5da0._12_4_;
        auVar46._12_4_ = auVar125._12_4_ * fVar12;
        fVar118 = local_5da0._16_4_;
        auVar46._16_4_ = auVar125._16_4_ * fVar118;
        fVar133 = local_5da0._20_4_;
        auVar46._20_4_ = auVar125._20_4_ * fVar133;
        fVar139 = local_5da0._24_4_;
        auVar46._24_4_ = auVar125._24_4_ * fVar139;
        auVar46._28_4_ = auVar125._28_4_;
        auVar156._0_4_ = auVar98._0_4_ + local_5ca0._0_4_;
        auVar156._4_4_ = auVar98._4_4_ + local_5ca0._4_4_;
        auVar156._8_4_ = auVar98._8_4_ + local_5ca0._8_4_;
        auVar156._12_4_ = auVar98._12_4_ + local_5ca0._12_4_;
        auVar156._16_4_ = auVar98._16_4_ + local_5ca0._16_4_;
        auVar156._20_4_ = auVar98._20_4_ + local_5ca0._20_4_;
        auVar156._24_4_ = auVar98._24_4_ + local_5ca0._24_4_;
        auVar156._28_4_ = auVar98._28_4_ + local_5ca0._28_4_;
        auVar15 = vfmsub231ps_fma(auVar46,local_5d80,auVar156);
        fVar106 = local_5d60._0_4_;
        fVar10 = local_5d60._4_4_;
        auVar47._4_4_ = auVar156._4_4_ * fVar10;
        auVar47._0_4_ = auVar156._0_4_ * fVar106;
        fVar103 = local_5d60._8_4_;
        auVar47._8_4_ = auVar156._8_4_ * fVar103;
        fVar13 = local_5d60._12_4_;
        auVar47._12_4_ = auVar156._12_4_ * fVar13;
        fVar129 = local_5d60._16_4_;
        auVar47._16_4_ = auVar156._16_4_ * fVar129;
        fVar135 = local_5d60._20_4_;
        auVar47._20_4_ = auVar156._20_4_ * fVar135;
        fVar146 = local_5d60._24_4_;
        auVar47._24_4_ = auVar156._24_4_ * fVar146;
        auVar47._28_4_ = auVar156._28_4_;
        auVar17 = vfmsub231ps_fma(auVar47,local_5da0,auVar164);
        auVar157._0_4_ = fVar130 * auVar17._0_4_;
        auVar157._4_4_ = fVar132 * auVar17._4_4_;
        auVar157._8_4_ = fVar134 * auVar17._8_4_;
        auVar157._12_4_ = fVar136 * auVar17._12_4_;
        auVar157._16_4_ = fVar138 * 0.0;
        auVar157._20_4_ = fVar140 * 0.0;
        auVar157._24_4_ = fVar176 * 0.0;
        auVar157._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar157,auVar128,ZEXT1632(auVar15));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar111,ZEXT1632(auVar16));
        auVar159 = ZEXT1664(auVar15);
        local_5dc0 = ZEXT1632(auVar15);
        auVar112 = vsubps_avx(auVar98,auVar151);
        auVar126._0_4_ = auVar98._0_4_ + auVar151._0_4_;
        auVar126._4_4_ = auVar98._4_4_ + auVar151._4_4_;
        auVar126._8_4_ = auVar98._8_4_ + auVar151._8_4_;
        auVar126._12_4_ = auVar98._12_4_ + auVar151._12_4_;
        auVar126._16_4_ = auVar98._16_4_ + auVar151._16_4_;
        auVar126._20_4_ = auVar98._20_4_ + auVar151._20_4_;
        auVar126._24_4_ = auVar98._24_4_ + auVar151._24_4_;
        auVar126._28_4_ = auVar98._28_4_ + auVar151._28_4_;
        auVar171 = vsubps_avx(auVar147,auVar165);
        auVar110._0_4_ = auVar147._0_4_ + auVar165._0_4_;
        auVar110._4_4_ = auVar147._4_4_ + auVar165._4_4_;
        auVar110._8_4_ = auVar147._8_4_ + auVar165._8_4_;
        auVar110._12_4_ = auVar147._12_4_ + auVar165._12_4_;
        auVar110._16_4_ = auVar147._16_4_ + auVar165._16_4_;
        auVar110._20_4_ = auVar147._20_4_ + auVar165._20_4_;
        auVar110._24_4_ = auVar147._24_4_ + auVar165._24_4_;
        auVar110._28_4_ = auVar147._28_4_ + auVar165._28_4_;
        auVar165 = vsubps_avx(auVar150,auVar122);
        auVar97._0_4_ = auVar150._0_4_ + auVar122._0_4_;
        auVar97._4_4_ = auVar150._4_4_ + auVar122._4_4_;
        auVar97._8_4_ = auVar150._8_4_ + auVar122._8_4_;
        auVar97._12_4_ = auVar150._12_4_ + auVar122._12_4_;
        auVar97._16_4_ = auVar150._16_4_ + auVar122._16_4_;
        auVar97._20_4_ = auVar150._20_4_ + auVar122._20_4_;
        auVar97._24_4_ = auVar150._24_4_ + auVar122._24_4_;
        auVar97._28_4_ = fVar119 + auVar122._28_4_;
        auVar48._4_4_ = auVar165._4_4_ * auVar110._4_4_;
        auVar48._0_4_ = auVar165._0_4_ * auVar110._0_4_;
        auVar48._8_4_ = auVar165._8_4_ * auVar110._8_4_;
        auVar48._12_4_ = auVar165._12_4_ * auVar110._12_4_;
        auVar48._16_4_ = auVar165._16_4_ * auVar110._16_4_;
        auVar48._20_4_ = auVar165._20_4_ * auVar110._20_4_;
        auVar48._24_4_ = auVar165._24_4_ * auVar110._24_4_;
        auVar48._28_4_ = fVar119;
        auVar17 = vfmsub231ps_fma(auVar48,auVar171,auVar97);
        auVar49._4_4_ = auVar112._4_4_ * auVar97._4_4_;
        auVar49._0_4_ = auVar112._0_4_ * auVar97._0_4_;
        auVar49._8_4_ = auVar112._8_4_ * auVar97._8_4_;
        auVar49._12_4_ = auVar112._12_4_ * auVar97._12_4_;
        auVar49._16_4_ = auVar112._16_4_ * auVar97._16_4_;
        auVar49._20_4_ = auVar112._20_4_ * auVar97._20_4_;
        auVar49._24_4_ = auVar112._24_4_ * auVar97._24_4_;
        auVar49._28_4_ = auVar97._28_4_;
        auVar16 = vfmsub231ps_fma(auVar49,auVar165,auVar126);
        auVar50._4_4_ = auVar126._4_4_ * auVar171._4_4_;
        auVar50._0_4_ = auVar126._0_4_ * auVar171._0_4_;
        auVar50._8_4_ = auVar126._8_4_ * auVar171._8_4_;
        auVar50._12_4_ = auVar126._12_4_ * auVar171._12_4_;
        auVar50._16_4_ = auVar126._16_4_ * auVar171._16_4_;
        auVar50._20_4_ = auVar126._20_4_ * auVar171._20_4_;
        auVar50._24_4_ = auVar126._24_4_ * auVar171._24_4_;
        auVar50._28_4_ = auVar126._28_4_;
        auVar18 = vfmsub231ps_fma(auVar50,auVar112,auVar110);
        auVar51._4_4_ = fVar132 * auVar18._4_4_;
        auVar51._0_4_ = fVar130 * auVar18._0_4_;
        auVar51._8_4_ = fVar134 * auVar18._8_4_;
        auVar51._12_4_ = fVar136 * auVar18._12_4_;
        auVar51._16_4_ = fVar138 * 0.0;
        auVar51._20_4_ = fVar140 * 0.0;
        auVar51._24_4_ = fVar176 * 0.0;
        auVar51._28_4_ = auVar110._28_4_;
        auVar16 = vfmadd231ps_fma(auVar51,auVar128,ZEXT1632(auVar16));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar111,ZEXT1632(auVar17));
        local_5e20 = ZEXT1632(CONCAT412(auVar16._12_4_ + auVar107._12_4_ + auVar15._12_4_,
                                        CONCAT48(auVar16._8_4_ + auVar107._8_4_ + auVar15._8_4_,
                                                 CONCAT44(auVar16._4_4_ +
                                                          auVar107._4_4_ + auVar15._4_4_,
                                                          auVar16._0_4_ +
                                                          auVar107._0_4_ + auVar15._0_4_))));
        auVar152 = ZEXT3264(local_5e20);
        local_5de0 = ZEXT1632(auVar107);
        auVar122 = vminps_avx(local_5de0,ZEXT1632(auVar15));
        auVar122 = vminps_avx(auVar122,ZEXT1632(auVar16));
        local_5e00 = vandps_avx(local_5e60,local_5e20);
        fVar119 = local_5e00._0_4_ * 1.1920929e-07;
        fVar130 = local_5e00._4_4_ * 1.1920929e-07;
        auVar52._4_4_ = fVar130;
        auVar52._0_4_ = fVar119;
        fVar132 = local_5e00._8_4_ * 1.1920929e-07;
        auVar52._8_4_ = fVar132;
        fVar134 = local_5e00._12_4_ * 1.1920929e-07;
        auVar52._12_4_ = fVar134;
        fVar136 = local_5e00._16_4_ * 1.1920929e-07;
        auVar52._16_4_ = fVar136;
        fVar138 = local_5e00._20_4_ * 1.1920929e-07;
        auVar52._20_4_ = fVar138;
        fVar140 = local_5e00._24_4_ * 1.1920929e-07;
        auVar52._24_4_ = fVar140;
        auVar52._28_4_ = 0x34000000;
        local_5f80._0_4_ = auVar167._0_4_;
        local_5f80._4_4_ = auVar167._4_4_;
        fStack_5f78 = auVar167._8_4_;
        fStack_5f74 = auVar167._12_4_;
        fStack_5f70 = auVar167._16_4_;
        fStack_5f6c = auVar167._20_4_;
        fStack_5f68 = auVar167._24_4_;
        uStack_5f64 = auVar167._28_4_;
        auVar144._0_4_ = (uint)fVar119 ^ local_5f80._0_4_;
        auVar144._4_4_ = (uint)fVar130 ^ local_5f80._4_4_;
        auVar144._8_4_ = (uint)fVar132 ^ (uint)fStack_5f78;
        auVar144._12_4_ = (uint)fVar134 ^ (uint)fStack_5f74;
        auVar144._16_4_ = (uint)fVar136 ^ (uint)fStack_5f70;
        auVar144._20_4_ = (uint)fVar138 ^ (uint)fStack_5f6c;
        auVar144._24_4_ = (uint)fVar140 ^ (uint)fStack_5f68;
        auVar144._28_4_ = uStack_5f64 ^ 0x34000000;
        auVar122 = vcmpps_avx(auVar122,auVar144,5);
        auVar150 = vmaxps_avx(local_5de0,ZEXT1632(auVar15));
        auVar147 = vmaxps_avx(auVar150,ZEXT1632(auVar16));
        auVar147 = vcmpps_avx(auVar147,auVar52,2);
        auVar151 = vorps_avx(auVar122,auVar147);
        auVar167 = ZEXT3264(auVar151);
        auVar123 = local_5f40 & auVar151;
        _local_5f20 = auVar108;
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
LAB_00695686:
          local_5e20 = auVar98;
          auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
        }
        else {
          auVar53._4_4_ = fVar10 * local_5d20._4_4_;
          auVar53._0_4_ = fVar106 * local_5d20._0_4_;
          auVar53._8_4_ = fVar103 * local_5d20._8_4_;
          auVar53._12_4_ = fVar13 * local_5d20._12_4_;
          auVar53._16_4_ = fVar129 * local_5d20._16_4_;
          auVar53._20_4_ = fVar135 * local_5d20._20_4_;
          auVar53._24_4_ = fVar146 * local_5d20._24_4_;
          auVar53._28_4_ = auVar122._28_4_;
          auVar54._4_4_ = fVar9 * local_5d40._4_4_;
          auVar54._0_4_ = fVar87 * local_5d40._0_4_;
          auVar54._8_4_ = fVar102 * local_5d40._8_4_;
          auVar54._12_4_ = fVar12 * local_5d40._12_4_;
          auVar54._16_4_ = fVar118 * local_5d40._16_4_;
          auVar54._20_4_ = fVar133 * local_5d40._20_4_;
          auVar54._24_4_ = fVar139 * local_5d40._24_4_;
          auVar54._28_4_ = auVar147._28_4_;
          auVar16 = vfmsub213ps_fma(local_5d40,local_5d80,auVar53);
          auVar55._4_4_ = fVar8 * auVar171._4_4_;
          auVar55._0_4_ = fVar104 * auVar171._0_4_;
          auVar55._8_4_ = fVar11 * auVar171._8_4_;
          auVar55._12_4_ = fVar105 * auVar171._12_4_;
          auVar55._16_4_ = fVar14 * auVar171._16_4_;
          auVar55._20_4_ = fVar131 * auVar171._20_4_;
          auVar55._24_4_ = fVar137 * auVar171._24_4_;
          auVar55._28_4_ = 0x34000000;
          auVar56._4_4_ = fVar9 * auVar165._4_4_;
          auVar56._0_4_ = fVar87 * auVar165._0_4_;
          auVar56._8_4_ = fVar102 * auVar165._8_4_;
          auVar56._12_4_ = fVar12 * auVar165._12_4_;
          auVar56._16_4_ = fVar118 * auVar165._16_4_;
          auVar56._20_4_ = fVar133 * auVar165._20_4_;
          auVar56._24_4_ = fVar139 * auVar165._24_4_;
          auVar56._28_4_ = auVar150._28_4_;
          auVar17 = vfmsub213ps_fma(auVar165,local_5d60,auVar55);
          auVar122 = vandps_avx(local_5e60,auVar53);
          auVar147 = vandps_avx(local_5e60,auVar55);
          auVar122 = vcmpps_avx(auVar122,auVar147,1);
          auVar150 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar122);
          auVar57._4_4_ = auVar112._4_4_ * fVar10;
          auVar57._0_4_ = auVar112._0_4_ * fVar106;
          auVar57._8_4_ = auVar112._8_4_ * fVar103;
          auVar57._12_4_ = auVar112._12_4_ * fVar13;
          auVar57._16_4_ = auVar112._16_4_ * fVar129;
          auVar57._20_4_ = auVar112._20_4_ * fVar135;
          auVar57._24_4_ = auVar112._24_4_ * fVar146;
          auVar57._28_4_ = auVar122._28_4_;
          auVar16 = vfmsub213ps_fma(auVar112,local_5d80,auVar56);
          auVar58._4_4_ = fVar8 * local_5d00._4_4_;
          auVar58._0_4_ = fVar104 * local_5d00._0_4_;
          auVar58._8_4_ = fVar11 * local_5d00._8_4_;
          auVar58._12_4_ = fVar105 * local_5d00._12_4_;
          auVar58._16_4_ = fVar14 * local_5d00._16_4_;
          auVar58._20_4_ = fVar131 * local_5d00._20_4_;
          auVar58._24_4_ = fVar137 * local_5d00._24_4_;
          auVar58._28_4_ = auVar147._28_4_;
          auVar17 = vfmsub213ps_fma(local_5d20,local_5da0,auVar58);
          auVar122 = vandps_avx(local_5e60,auVar58);
          auVar147 = vandps_avx(local_5e60,auVar56);
          auVar122 = vcmpps_avx(auVar122,auVar147,1);
          auVar165 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17),auVar122);
          auVar159 = ZEXT3264(auVar165);
          auVar16 = vfmsub213ps_fma(local_5d00,local_5d60,auVar54);
          auVar17 = vfmsub213ps_fma(auVar171,local_5da0,auVar57);
          auVar122 = vandps_avx(local_5e60,auVar54);
          auVar147 = vandps_avx(local_5e60,auVar57);
          auVar98 = vcmpps_avx(auVar122,auVar147,1);
          auVar147 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar98);
          auVar152 = ZEXT3264(auVar147);
          local_5f20._0_4_ = auVar75._0_4_;
          local_5f20._4_4_ = auVar75._4_4_;
          auStack_5f18._0_4_ = auVar75._8_4_;
          auStack_5f18._4_4_ = auVar75._12_4_;
          fStack_5f10 = auVar75._16_4_;
          fStack_5f0c = auVar75._20_4_;
          fStack_5f08 = auVar75._24_4_;
          auVar59._4_4_ = auVar147._4_4_ * (float)local_5f20._4_4_;
          auVar59._0_4_ = auVar147._0_4_ * (float)local_5f20._0_4_;
          auVar59._8_4_ = auVar147._8_4_ * (float)auStack_5f18._0_4_;
          auVar59._12_4_ = auVar147._12_4_ * (float)auStack_5f18._4_4_;
          auVar59._16_4_ = auVar147._16_4_ * fStack_5f10;
          auVar59._20_4_ = auVar147._20_4_ * fStack_5f0c;
          auVar59._24_4_ = auVar147._24_4_ * fStack_5f08;
          auVar59._28_4_ = auVar98._28_4_;
          auVar16 = vfmadd213ps_fma(auVar128,auVar165,auVar59);
          auVar16 = vfmadd213ps_fma(auVar111,auVar150,ZEXT1632(auVar16));
          fVar87 = auVar16._0_4_ + auVar16._0_4_;
          fVar119 = auVar16._4_4_ + auVar16._4_4_;
          fVar104 = auVar16._8_4_ + auVar16._8_4_;
          fVar106 = auVar16._12_4_ + auVar16._12_4_;
          auVar98 = ZEXT1632(CONCAT412(fVar106,CONCAT48(fVar104,CONCAT44(fVar119,fVar87))));
          auVar60._4_4_ = auVar147._4_4_ * fVar180;
          auVar60._0_4_ = auVar147._0_4_ * fVar177;
          auVar60._8_4_ = auVar147._8_4_ * fVar181;
          auVar60._12_4_ = auVar147._12_4_ * fVar182;
          auVar60._16_4_ = auVar147._16_4_ * fVar183;
          auVar60._20_4_ = auVar147._20_4_ * fVar184;
          auVar60._24_4_ = auVar147._24_4_ * fVar185;
          auVar60._28_4_ = auVar122._28_4_;
          auVar16 = vfmadd213ps_fma(local_5cc0,auVar165,auVar60);
          auVar17 = vfmadd213ps_fma(local_5ca0,auVar150,ZEXT1632(auVar16));
          auVar128 = vrcpps_avx(auVar98);
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = &DAT_3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          auVar149._16_4_ = 0x3f800000;
          auVar149._20_4_ = 0x3f800000;
          auVar149._24_4_ = 0x3f800000;
          auVar149._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar128,auVar98,auVar149);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar128,auVar128);
          auVar61._28_4_ = auVar128._28_4_;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412((auVar17._12_4_ + auVar17._12_4_) * auVar16._12_4_,
                                  CONCAT48((auVar17._8_4_ + auVar17._8_4_) * auVar16._8_4_,
                                           CONCAT44((auVar17._4_4_ + auVar17._4_4_) * auVar16._4_4_,
                                                    (auVar17._0_4_ + auVar17._0_4_) * auVar16._0_4_)
                                          )));
          auVar128 = *(undefined1 (*) [32])(ray + 0x100);
          auVar111 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar61,2);
          auVar122 = vcmpps_avx(auVar61,auVar128,2);
          auVar111 = vandps_avx(auVar111,auVar122);
          auVar145._0_4_ = (uint)fVar87 ^ local_5f80._0_4_;
          auVar145._4_4_ = (uint)fVar119 ^ local_5f80._4_4_;
          auVar145._8_4_ = (uint)fVar104 ^ (uint)fStack_5f78;
          auVar145._12_4_ = (uint)fVar106 ^ (uint)fStack_5f74;
          auVar145._16_4_ = fStack_5f70;
          auVar145._20_4_ = fStack_5f6c;
          auVar145._24_4_ = fStack_5f68;
          auVar145._28_4_ = uStack_5f64;
          auVar122 = vcmpps_avx(auVar98,auVar145,4);
          auVar111 = vandps_avx(auVar122,auVar111);
          auVar122 = vandps_avx(auVar151,local_5f40);
          auVar111 = vpslld_avx2(auVar111,0x1f);
          auVar112 = vpsrad_avx2(auVar111,0x1f);
          auVar111 = auVar122 & auVar112;
          auVar98 = local_5e20;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) goto LAB_00695686;
          auVar111 = vandps_avx(auVar112,auVar122);
          uVar2 = *(uint *)(lVar83 + -0x10 + uVar82 * 4);
          auVar79 = (undefined1  [8])(context->scene->geometries).items[uVar2].ptr;
          uVar3 = ((Geometry *)auVar79)->mask;
          auVar113._4_4_ = uVar3;
          auVar113._0_4_ = uVar3;
          auVar113._8_4_ = uVar3;
          auVar113._12_4_ = uVar3;
          auVar113._16_4_ = uVar3;
          auVar113._20_4_ = uVar3;
          auVar113._24_4_ = uVar3;
          auVar113._28_4_ = uVar3;
          auVar122 = vpand_avx2(auVar113,*(undefined1 (*) [32])(ray + 0x120));
          auVar98 = vpcmpeqd_avx2(auVar122,_DAT_02020f00);
          auVar122 = auVar111 & ~auVar98;
          auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            uVar85 = *(undefined4 *)(lVar83 + uVar82 * 4);
            auVar111 = vandnps_avx(auVar98,auVar111);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (((Geometry *)auVar79)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar122 = vrcpps_avx(local_5e20);
              auVar155._8_4_ = 0x3f800000;
              auVar155._0_8_ = &DAT_3f8000003f800000;
              auVar155._12_4_ = 0x3f800000;
              auVar155._16_4_ = 0x3f800000;
              auVar155._20_4_ = 0x3f800000;
              auVar155._24_4_ = 0x3f800000;
              auVar155._28_4_ = 0x3f800000;
              auVar16 = vfnmadd213ps_fma(local_5e20,auVar122,auVar155);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar122,auVar122);
              auVar100._8_4_ = 0x219392ef;
              auVar100._0_8_ = 0x219392ef219392ef;
              auVar100._12_4_ = 0x219392ef;
              auVar100._16_4_ = 0x219392ef;
              auVar100._20_4_ = 0x219392ef;
              auVar100._24_4_ = 0x219392ef;
              auVar100._28_4_ = 0x219392ef;
              auVar122 = vcmpps_avx(local_5e00,auVar100,5);
              auVar122 = vandps_avx(auVar122,ZEXT1632(auVar16));
              auVar64._4_4_ = auVar122._4_4_ * auVar107._4_4_;
              auVar64._0_4_ = auVar122._0_4_ * auVar107._0_4_;
              auVar64._8_4_ = auVar122._8_4_ * auVar107._8_4_;
              auVar64._12_4_ = auVar122._12_4_ * auVar107._12_4_;
              auVar64._16_4_ = auVar122._16_4_ * 0.0;
              auVar64._20_4_ = auVar122._20_4_ * 0.0;
              auVar64._24_4_ = auVar122._24_4_ * 0.0;
              auVar64._28_4_ = local_5e00._28_4_;
              auVar98 = vminps_avx(auVar64,auVar155);
              auVar65._4_4_ = auVar122._4_4_ * auVar15._4_4_;
              auVar65._0_4_ = auVar122._0_4_ * auVar15._0_4_;
              auVar65._8_4_ = auVar122._8_4_ * auVar15._8_4_;
              auVar65._12_4_ = auVar122._12_4_ * auVar15._12_4_;
              auVar65._16_4_ = auVar122._16_4_ * 0.0;
              auVar65._20_4_ = auVar122._20_4_ * 0.0;
              auVar65._24_4_ = auVar122._24_4_ * 0.0;
              auVar65._28_4_ = auVar122._28_4_;
              auVar122 = vminps_avx(auVar65,auVar155);
              auVar112 = vsubps_avx(auVar155,auVar98);
              auVar171 = vsubps_avx(auVar155,auVar122);
              auVar70._8_8_ = uStack_5998;
              auVar70._0_8_ = local_59a0;
              auVar70._16_8_ = uStack_5990;
              auVar70._24_8_ = uStack_5988;
              local_5c20 = vblendvps_avx(auVar98,auVar112,auVar70);
              local_5c00 = vblendvps_avx(auVar122,auVar171,auVar70);
              pRVar6 = context->user;
              local_5be0._4_4_ = uVar85;
              local_5be0._0_4_ = uVar85;
              local_5be0._8_4_ = uVar85;
              local_5be0._12_4_ = uVar85;
              local_5be0._16_4_ = uVar85;
              local_5be0._20_4_ = uVar85;
              local_5be0._24_4_ = uVar85;
              local_5be0._28_4_ = uVar85;
              auVar98 = vpcmpeqd_avx2(local_5c20,local_5c20);
              local_5ef8[1] = auVar98;
              *local_5ef8 = auVar98;
              local_5ba0 = pRVar6->instID[0];
              local_5b80 = pRVar6->instPrimID[0];
              auVar122 = vblendvps_avx(auVar128,auVar61,auVar111);
              *(undefined1 (*) [32])(ray + 0x100) = auVar122;
              local_5ef0.valid = (int *)local_5ea0;
              local_5ef0.geometryUserPtr = ((Geometry *)auVar79)->userPtr;
              local_5ef0.context = context->user;
              local_5ef0.hit = local_5c80;
              local_5ef0.N = 8;
              local_5ef0.ray = (RTCRayN *)ray;
              local_5ea0 = auVar111;
              local_5c80 = (RTCHitN  [32])auVar150;
              local_5c60 = auVar165;
              local_5c40 = auVar147;
              local_5bc0 = uVar2;
              uStack_5bbc = uVar2;
              uStack_5bb8 = uVar2;
              uStack_5bb4 = uVar2;
              uStack_5bb0 = uVar2;
              uStack_5bac = uVar2;
              uStack_5ba8 = uVar2;
              uStack_5ba4 = uVar2;
              uStack_5b9c = local_5ba0;
              uStack_5b98 = local_5ba0;
              uStack_5b94 = local_5ba0;
              uStack_5b90 = local_5ba0;
              uStack_5b8c = local_5ba0;
              uStack_5b88 = local_5ba0;
              uStack_5b84 = local_5ba0;
              uStack_5b7c = local_5b80;
              uStack_5b78 = local_5b80;
              uStack_5b74 = local_5b80;
              uStack_5b70 = local_5b80;
              uStack_5b6c = local_5b80;
              uStack_5b68 = local_5b80;
              uStack_5b64 = local_5b80;
              _local_5f80 = auVar128;
              if (((Geometry *)auVar79)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                _auStack_5f18 = auVar108._8_24_;
                local_5f20 = auVar79;
                auVar152 = ZEXT1664(auVar147._0_16_);
                auVar159 = ZEXT1664(auVar165._0_16_);
                auVar167 = ZEXT1664(auVar151._0_16_);
                (*((Geometry *)auVar79)->occlusionFilterN)(&local_5ef0);
                auVar170._8_56_ = extraout_var;
                auVar170._0_8_ = extraout_XMM1_Qa;
                auVar98 = vpcmpeqd_avx2(auVar170._0_32_,auVar170._0_32_);
                auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar79 = local_5f20;
                uVar84 = local_5f88;
              }
              auVar111 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_5ea0);
              auVar128 = auVar98 & ~auVar111;
              if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar128 >> 0x7f,0) == '\0') &&
                    (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar128 >> 0xbf,0) == '\0') &&
                  (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar128[0x1f]) {
                auVar111 = auVar111 ^ auVar98;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((((Geometry *)auVar79)->field_8).field_0x2 & 0x40) != 0)))) {
                  auVar152 = ZEXT1664(auVar152._0_16_);
                  auVar159 = ZEXT1664(auVar159._0_16_);
                  auVar167 = ZEXT1664(auVar167._0_16_);
                  (*p_Var7)(&local_5ef0);
                  auVar175._8_56_ = extraout_var_00;
                  auVar175._0_8_ = extraout_XMM1_Qa_00;
                  auVar98 = vpcmpeqd_avx2(auVar175._0_32_,auVar175._0_32_);
                  auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar84 = local_5f88;
                }
                auVar128 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_5ea0);
                auVar111 = auVar128 ^ auVar98;
                auVar115._8_4_ = 0xff800000;
                auVar115._0_8_ = 0xff800000ff800000;
                auVar115._12_4_ = 0xff800000;
                auVar115._16_4_ = 0xff800000;
                auVar115._20_4_ = 0xff800000;
                auVar115._24_4_ = 0xff800000;
                auVar115._28_4_ = 0xff800000;
                auVar128 = vblendvps_avx(auVar115,*(undefined1 (*) [32])(local_5ef0.ray + 0x100),
                                         auVar128);
                *(undefined1 (*) [32])(local_5ef0.ray + 0x100) = auVar128;
              }
              auVar128 = vblendvps_avx(_local_5f80,*(undefined1 (*) [32])local_5f48,auVar111);
              *(undefined1 (*) [32])local_5f48 = auVar128;
            }
            local_5f40 = vandnps_avx(auVar111,local_5f40);
          }
        }
        bVar86 = (((((((local_5f40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_5f40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_5f40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_5f40 >> 0x7f,0) != '\0') ||
                   (local_5f40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_5f40 >> 0xbf,0) != '\0') ||
                 (local_5f40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_5f40[0x1f] < '\0';
      }
      auVar175 = ZEXT3264(local_5e60);
      if ((!bVar86) || (unaff_R15 = uVar82 + 1, bVar86 = 2 < uVar82, uVar82 = unaff_R15, bVar86))
      break;
    }
    auVar108 = vandps_avx(local_5f40,local_5ec0);
    auVar128 = local_5ec0 & local_5f40;
    auVar111 = local_5ec0;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar128 >> 0x7f,0) == '\0') &&
          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0xbf,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f])
    break;
  }
  auVar128 = vpcmpeqd_avx2(auVar111,auVar111);
  auVar101._0_4_ = auVar108._0_4_ ^ auVar128._0_4_;
  auVar101._4_4_ = auVar108._4_4_ ^ auVar128._4_4_;
  auVar101._8_4_ = auVar108._8_4_ ^ auVar128._8_4_;
  auVar101._12_4_ = auVar108._12_4_ ^ auVar128._12_4_;
  auVar101._16_4_ = auVar108._16_4_ ^ auVar128._16_4_;
  auVar101._20_4_ = auVar108._20_4_ ^ auVar128._20_4_;
  auVar101._24_4_ = auVar108._24_4_ ^ auVar128._24_4_;
  auVar101._28_4_ = auVar108._28_4_ ^ auVar128._28_4_;
LAB_006957d2:
  auVar117 = ZEXT3264(auVar128);
  local_5e40 = vorps_avx(auVar101,local_5e40);
  auVar128 = auVar128 & ~local_5e40;
  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0x7f,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar128 >> 0xbf,0) == '\0') &&
      (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f]) {
LAB_00695810:
    iVar76 = 3;
  }
  else {
    auVar117 = ZEXT3264(local_59c0);
    auVar127._8_4_ = 0xff800000;
    auVar127._0_8_ = 0xff800000ff800000;
    auVar127._12_4_ = 0xff800000;
    auVar127._16_4_ = 0xff800000;
    auVar127._20_4_ = 0xff800000;
    auVar127._24_4_ = 0xff800000;
    auVar127._28_4_ = 0xff800000;
    local_59c0 = vblendvps_avx(local_59c0,auVar127,local_5e40);
    iVar76 = 0;
  }
LAB_00695813:
  if (iVar76 == 3) {
    auVar128 = vandps_avx(local_5960,local_5e40);
    auVar116._8_4_ = 0xff800000;
    auVar116._0_8_ = 0xff800000ff800000;
    auVar116._12_4_ = 0xff800000;
    auVar116._16_4_ = 0xff800000;
    auVar116._20_4_ = 0xff800000;
    auVar116._24_4_ = 0xff800000;
    auVar116._28_4_ = 0xff800000;
    auVar128 = vmaskmovps_avx(auVar128,auVar116);
    *(undefined1 (*) [32])local_5f48 = auVar128;
    return;
  }
  goto LAB_00694512;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }